

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

bool embree::avx512::CurveNiMBIntersectorK<8,4>::
     occluded_t<embree::avx512::SweepCurve1IntersectorK<embree::BSplineCurveT,4>,embree::avx512::Occluded1KEpilog1<4,true>>
               (Precalculations *pre,RayK<4> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  float *pfVar1;
  undefined1 auVar2 [16];
  Geometry *pGVar3;
  __int_type_conflict _Var4;
  long lVar5;
  long lVar6;
  RTCFilterFunctionN p_Var7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  undefined8 uVar18;
  undefined8 uVar19;
  undefined8 uVar20;
  int iVar21;
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  float fVar35;
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  byte bVar63;
  byte bVar64;
  byte bVar65;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  long lVar66;
  byte bVar67;
  ulong uVar68;
  ulong uVar69;
  byte bVar70;
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  long lVar71;
  bool bVar72;
  ulong uVar73;
  uint uVar74;
  uint uVar134;
  uint uVar135;
  uint uVar137;
  uint uVar138;
  uint uVar139;
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  undefined1 auVar87 [32];
  undefined1 auVar88 [32];
  undefined1 auVar89 [32];
  undefined1 auVar90 [32];
  undefined1 auVar91 [32];
  undefined1 auVar92 [32];
  undefined1 auVar93 [32];
  undefined1 auVar94 [32];
  undefined1 auVar95 [32];
  undefined1 auVar96 [32];
  undefined1 auVar97 [32];
  undefined1 auVar98 [32];
  undefined1 auVar99 [32];
  undefined1 auVar100 [32];
  undefined1 auVar101 [32];
  undefined1 auVar102 [32];
  undefined1 auVar103 [32];
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  uint uVar136;
  uint uVar140;
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  float pp;
  float fVar141;
  float fVar157;
  float fVar158;
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  float fVar159;
  float fVar160;
  float fVar161;
  float fVar162;
  undefined1 auVar150 [32];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  undefined1 extraout_var_01 [60];
  undefined1 extraout_var_02 [60];
  undefined4 uVar163;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar175 [16];
  undefined1 auVar179 [32];
  float fVar180;
  float fVar181;
  float fVar202;
  float fVar203;
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  float fVar204;
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar211 [16];
  float fVar213;
  float fVar214;
  float fVar215;
  undefined1 auVar212 [32];
  float fVar224;
  undefined1 auVar216 [16];
  undefined1 auVar217 [16];
  float fVar225;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar226 [16];
  float fVar230;
  undefined1 auVar227 [32];
  undefined1 auVar228 [32];
  undefined1 auVar229 [64];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [16];
  undefined1 auVar234 [32];
  undefined1 auVar235 [64];
  float fVar236;
  undefined1 auVar237 [32];
  float fVar239;
  float fVar240;
  undefined1 auVar238 [64];
  undefined1 auVar241 [64];
  undefined1 auVar242 [64];
  undefined1 auVar243 [28];
  float fVar244;
  undefined1 auVar245 [64];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  float fVar254;
  undefined1 auVar255 [16];
  undefined1 auVar256 [64];
  undefined1 auVar257 [64];
  undefined1 auVar258 [64];
  undefined1 auVar259 [64];
  undefined1 auVar260 [64];
  undefined1 auVar261 [64];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  vfloatx_conflict vu0;
  BBox<embree::vfloat_impl<8>_> tp1;
  vfloat<8> dOdO;
  StackEntry stack [3];
  int local_a20;
  undefined1 local_880 [16];
  uint local_870;
  uint local_86c;
  float local_868;
  float local_864;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [16];
  undefined1 local_790 [16];
  ulong local_778;
  RTCFilterFunctionNArguments local_770;
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [8];
  float fStack_6d8;
  float fStack_6d4;
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [16];
  undefined1 local_650 [16];
  float local_640;
  float fStack_63c;
  float fStack_638;
  float fStack_634;
  undefined1 local_630 [16];
  undefined1 local_620 [16];
  Primitive *local_610;
  ulong local_608;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [8];
  float fStack_598;
  float fStack_594;
  undefined1 auStack_590 [16];
  undefined1 local_580 [32];
  undefined1 local_550 [16];
  undefined1 local_540 [16];
  undefined1 local_530 [16];
  RTCHitN local_520 [16];
  undefined1 auStack_510 [16];
  undefined4 local_500;
  undefined4 uStack_4fc;
  undefined4 uStack_4f8;
  undefined4 uStack_4f4;
  float local_4f0;
  float fStack_4ec;
  float fStack_4e8;
  float fStack_4e4;
  undefined1 local_4e0 [16];
  undefined8 local_4d0;
  undefined8 uStack_4c8;
  undefined1 local_4c0 [16];
  uint local_4b0;
  uint uStack_4ac;
  uint uStack_4a8;
  uint uStack_4a4;
  uint uStack_4a0;
  uint uStack_49c;
  uint uStack_498;
  uint uStack_494;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  float fStack_3e4;
  undefined1 local_3e0 [8];
  float fStack_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float fStack_3c8;
  float fStack_3c4;
  float local_3c0;
  float fStack_3bc;
  float fStack_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float fStack_3a8;
  float fStack_3a4;
  undefined1 local_390 [16];
  undefined1 local_380 [32];
  undefined1 local_360 [8];
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  float fStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float fStack_2c8;
  float fStack_2c4;
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [32];
  undefined1 local_260 [32];
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined1 local_200 [32];
  undefined1 local_1e0 [32];
  undefined1 local_1c0 [8];
  float fStack_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  byte abStack_180 [32];
  uint auStack_160 [8];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 auVar251 [64];
  
  uVar73 = (ulong)(byte)prim[1];
  lVar66 = uVar73 * 0x25;
  auVar76._8_8_ = 0;
  auVar76._0_8_ = *(ulong *)(prim + uVar73 * 4 + 6);
  auVar102 = vpmovsxbd_avx2(auVar76);
  auVar75._8_8_ = 0;
  auVar75._0_8_ = *(ulong *)(prim + uVar73 * 5 + 6);
  auVar99 = vpmovsxbd_avx2(auVar75);
  auVar84._8_8_ = 0;
  auVar84._0_8_ = *(ulong *)(prim + uVar73 * 6 + 6);
  auVar104 = vpmovsxbd_avx2(auVar84);
  auVar78._8_8_ = 0;
  auVar78._0_8_ = *(ulong *)(prim + uVar73 * 0xf + 6);
  auVar105 = vpmovsxbd_avx2(auVar78);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = *(ulong *)(prim + (ulong)(byte)prim[1] * 0x10 + 6);
  auVar103 = vpmovsxbd_avx2(auVar2);
  auVar83._8_8_ = 0;
  auVar83._0_8_ = *(ulong *)(prim + uVar73 * 0x11 + 6);
  auVar100 = vpmovsxbd_avx2(auVar83);
  auVar82._8_8_ = 0;
  auVar82._0_8_ = *(ulong *)(prim + uVar73 * 0x1a + 6);
  auVar101 = vpmovsxbd_avx2(auVar82);
  auVar77._8_8_ = 0;
  auVar77._0_8_ = *(ulong *)(prim + uVar73 * 0x1b + 6);
  auVar94 = vpmovsxbd_avx2(auVar77);
  fVar236 = *(float *)(prim + lVar66 + 0x12);
  auVar80._4_4_ = fVar236;
  auVar80._0_4_ = fVar236;
  auVar80._8_4_ = fVar236;
  auVar80._12_4_ = fVar236;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x10);
  auVar76 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar76 = vsubps_avx(auVar76,*(undefined1 (*) [16])(prim + lVar66 + 6));
  auVar79._8_8_ = 0;
  auVar79._0_8_ = *(ulong *)(prim + uVar73 * 0x1c + 6);
  auVar95 = vpmovsxbd_avx2(auVar79);
  fVar16 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar66 + 0x16)) *
           *(float *)(prim + lVar66 + 0x1a);
  auVar106 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 7 + 6));
  auVar107 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0xb + 6));
  auVar108 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 9 + 6));
  auVar85 = vpbroadcastd_avx512vl();
  auVar86 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar73 * 0xd + 6));
  auVar87 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar73 * 0x12 + 6));
  auVar88 = vpmovsxwd_avx512vl(*(undefined1 (*) [16])(prim + uVar73 * 0x16 + 6));
  auVar75 = vinsertps_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                              ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  auVar75 = vinsertps_avx512f(auVar75,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  fVar254 = fVar236 * auVar76._0_4_;
  auVar75 = vmulps_avx512vl(auVar80,auVar75);
  auVar89 = vcvtdq2ps_avx512vl(auVar102);
  auVar90 = vcvtdq2ps_avx512vl(auVar99);
  auVar91 = vcvtdq2ps_avx512vl(auVar104);
  auVar92 = vcvtdq2ps_avx512vl(auVar105);
  auVar93 = vcvtdq2ps_avx512vl(auVar103);
  auVar102 = vcvtdq2ps_avx(auVar100);
  auVar104 = vcvtdq2ps_avx(auVar101);
  auVar105 = vcvtdq2ps_avx(auVar94);
  auVar103 = vcvtdq2ps_avx(auVar95);
  auVar94 = vbroadcastss_avx512vl(ZEXT416(1));
  uVar163 = auVar75._0_4_;
  auVar109._4_4_ = uVar163;
  auVar109._0_4_ = uVar163;
  auVar109._8_4_ = uVar163;
  auVar109._12_4_ = uVar163;
  auVar109._16_4_ = uVar163;
  auVar109._20_4_ = uVar163;
  auVar109._24_4_ = uVar163;
  auVar109._28_4_ = uVar163;
  auVar95 = vpermps_avx512vl(auVar94,ZEXT1632(auVar75));
  auVar96 = vbroadcastss_avx512vl(ZEXT416(2));
  auVar97 = vpermps_avx512vl(auVar96,ZEXT1632(auVar75));
  auVar98 = vmulps_avx512vl(auVar97,auVar91);
  auVar100._4_4_ = auVar97._4_4_ * auVar102._4_4_;
  auVar100._0_4_ = auVar97._0_4_ * auVar102._0_4_;
  auVar100._8_4_ = auVar97._8_4_ * auVar102._8_4_;
  auVar100._12_4_ = auVar97._12_4_ * auVar102._12_4_;
  auVar100._16_4_ = auVar97._16_4_ * auVar102._16_4_;
  auVar100._20_4_ = auVar97._20_4_ * auVar102._20_4_;
  auVar100._24_4_ = auVar97._24_4_ * auVar102._24_4_;
  auVar100._28_4_ = auVar99._28_4_;
  auVar101._4_4_ = auVar103._4_4_ * auVar97._4_4_;
  auVar101._0_4_ = auVar103._0_4_ * auVar97._0_4_;
  auVar101._8_4_ = auVar103._8_4_ * auVar97._8_4_;
  auVar101._12_4_ = auVar103._12_4_ * auVar97._12_4_;
  auVar101._16_4_ = auVar103._16_4_ * auVar97._16_4_;
  auVar101._20_4_ = auVar103._20_4_ * auVar97._20_4_;
  auVar101._24_4_ = auVar103._24_4_ * auVar97._24_4_;
  auVar101._28_4_ = auVar97._28_4_;
  auVar99 = vfmadd231ps_avx512vl(auVar98,auVar95,auVar90);
  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar95,auVar93);
  auVar75 = vfmadd231ps_fma(auVar101,auVar105,auVar95);
  auVar99 = vfmadd231ps_avx512vl(auVar99,auVar109,auVar89);
  auVar100 = vfmadd231ps_avx512vl(auVar100,auVar109,auVar92);
  auVar75 = vfmadd231ps_fma(ZEXT1632(auVar75),auVar104,auVar109);
  auVar97._4_4_ = fVar254;
  auVar97._0_4_ = fVar254;
  auVar97._8_4_ = fVar254;
  auVar97._12_4_ = fVar254;
  auVar97._16_4_ = fVar254;
  auVar97._20_4_ = fVar254;
  auVar97._24_4_ = fVar254;
  auVar97._28_4_ = fVar254;
  auVar95 = ZEXT1632(CONCAT412(fVar236 * auVar76._12_4_,
                               CONCAT48(fVar236 * auVar76._8_4_,
                                        CONCAT44(fVar236 * auVar76._4_4_,fVar254))));
  auVar101 = vpermps_avx512vl(auVar94,auVar95);
  auVar96 = vpermps_avx512vl(auVar96,auVar95);
  auVar91 = vmulps_avx512vl(auVar96,auVar91);
  auVar94._4_4_ = auVar96._4_4_ * auVar102._4_4_;
  auVar94._0_4_ = auVar96._0_4_ * auVar102._0_4_;
  auVar94._8_4_ = auVar96._8_4_ * auVar102._8_4_;
  auVar94._12_4_ = auVar96._12_4_ * auVar102._12_4_;
  auVar94._16_4_ = auVar96._16_4_ * auVar102._16_4_;
  auVar94._20_4_ = auVar96._20_4_ * auVar102._20_4_;
  auVar94._24_4_ = auVar96._24_4_ * auVar102._24_4_;
  auVar94._28_4_ = uVar163;
  auVar95._4_4_ = auVar96._4_4_ * auVar103._4_4_;
  auVar95._0_4_ = auVar96._0_4_ * auVar103._0_4_;
  auVar95._8_4_ = auVar96._8_4_ * auVar103._8_4_;
  auVar95._12_4_ = auVar96._12_4_ * auVar103._12_4_;
  auVar95._16_4_ = auVar96._16_4_ * auVar103._16_4_;
  auVar95._20_4_ = auVar96._20_4_ * auVar103._20_4_;
  auVar95._24_4_ = auVar96._24_4_ * auVar103._24_4_;
  auVar95._28_4_ = auVar102._28_4_;
  auVar102 = vfmadd231ps_avx512vl(auVar91,auVar101,auVar90);
  auVar103 = vfmadd231ps_avx512vl(auVar94,auVar101,auVar93);
  auVar76 = vfmadd231ps_fma(auVar95,auVar101,auVar105);
  auVar101 = vfmadd231ps_avx512vl(auVar102,auVar97,auVar89);
  auVar103 = vfmadd231ps_avx512vl(auVar103,auVar97,auVar92);
  auVar80 = vfmadd231ps_fma(ZEXT1632(auVar76),auVar97,auVar104);
  auVar92._8_4_ = 0x7fffffff;
  auVar92._0_8_ = 0x7fffffff7fffffff;
  auVar92._12_4_ = 0x7fffffff;
  auVar92._16_4_ = 0x7fffffff;
  auVar92._20_4_ = 0x7fffffff;
  auVar92._24_4_ = 0x7fffffff;
  auVar92._28_4_ = 0x7fffffff;
  auVar96._8_4_ = 0x219392ef;
  auVar96._0_8_ = 0x219392ef219392ef;
  auVar96._12_4_ = 0x219392ef;
  auVar96._16_4_ = 0x219392ef;
  auVar96._20_4_ = 0x219392ef;
  auVar96._24_4_ = 0x219392ef;
  auVar96._28_4_ = 0x219392ef;
  auVar102 = vandps_avx(auVar92,auVar99);
  uVar68 = vcmpps_avx512vl(auVar102,auVar96,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar89._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar89._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar89._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar89._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._12_4_;
  bVar72 = (bool)((byte)(uVar68 >> 4) & 1);
  auVar89._16_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._16_4_;
  bVar72 = (bool)((byte)(uVar68 >> 5) & 1);
  auVar89._20_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._20_4_;
  bVar72 = (bool)((byte)(uVar68 >> 6) & 1);
  auVar89._24_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._24_4_;
  bVar72 = SUB81(uVar68 >> 7,0);
  auVar89._28_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar99._28_4_;
  auVar102 = vandps_avx(auVar92,auVar100);
  uVar68 = vcmpps_avx512vl(auVar102,auVar96,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar90._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar90._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar90._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar90._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._12_4_;
  bVar72 = (bool)((byte)(uVar68 >> 4) & 1);
  auVar90._16_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._16_4_;
  bVar72 = (bool)((byte)(uVar68 >> 5) & 1);
  auVar90._20_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._20_4_;
  bVar72 = (bool)((byte)(uVar68 >> 6) & 1);
  auVar90._24_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._24_4_;
  bVar72 = SUB81(uVar68 >> 7,0);
  auVar90._28_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar100._28_4_;
  auVar102 = vandps_avx(auVar92,ZEXT1632(auVar75));
  uVar68 = vcmpps_avx512vl(auVar102,auVar96,1);
  bVar72 = (bool)((byte)uVar68 & 1);
  auVar102._0_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar75._0_4_;
  bVar72 = (bool)((byte)(uVar68 >> 1) & 1);
  auVar102._4_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar75._4_4_;
  bVar72 = (bool)((byte)(uVar68 >> 2) & 1);
  auVar102._8_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar75._8_4_;
  bVar72 = (bool)((byte)(uVar68 >> 3) & 1);
  auVar102._12_4_ = (uint)bVar72 * 0x219392ef | (uint)!bVar72 * auVar75._12_4_;
  auVar102._16_4_ = (uint)((byte)(uVar68 >> 4) & 1) * 0x219392ef;
  auVar102._20_4_ = (uint)((byte)(uVar68 >> 5) & 1) * 0x219392ef;
  auVar102._24_4_ = (uint)((byte)(uVar68 >> 6) & 1) * 0x219392ef;
  auVar102._28_4_ = (uint)(byte)(uVar68 >> 7) * 0x219392ef;
  auVar104 = vrcp14ps_avx512vl(auVar89);
  auVar93._8_4_ = 0x3f800000;
  auVar93._0_8_ = 0x3f8000003f800000;
  auVar93._12_4_ = 0x3f800000;
  auVar93._16_4_ = 0x3f800000;
  auVar93._20_4_ = 0x3f800000;
  auVar93._24_4_ = 0x3f800000;
  auVar93._28_4_ = 0x3f800000;
  auVar76 = vfnmadd213ps_fma(auVar89,auVar104,auVar93);
  auVar76 = vfmadd132ps_fma(ZEXT1632(auVar76),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar90);
  auVar75 = vfnmadd213ps_fma(auVar90,auVar104,auVar93);
  auVar75 = vfmadd132ps_fma(ZEXT1632(auVar75),auVar104,auVar104);
  auVar104 = vrcp14ps_avx512vl(auVar102);
  auVar84 = vfnmadd213ps_fma(auVar102,auVar104,auVar93);
  auVar84 = vfmadd132ps_fma(ZEXT1632(auVar84),auVar104,auVar104);
  auVar91._4_4_ = fVar16;
  auVar91._0_4_ = fVar16;
  auVar91._8_4_ = fVar16;
  auVar91._12_4_ = fVar16;
  auVar91._16_4_ = fVar16;
  auVar91._20_4_ = fVar16;
  auVar91._24_4_ = fVar16;
  auVar91._28_4_ = fVar16;
  auVar102 = vcvtdq2ps_avx(auVar106);
  auVar104 = vcvtdq2ps_avx(auVar107);
  auVar104 = vsubps_avx(auVar104,auVar102);
  auVar78 = vfmadd213ps_fma(auVar104,auVar91,auVar102);
  auVar102 = vcvtdq2ps_avx(auVar108);
  auVar104 = vcvtdq2ps_avx512vl(auVar86);
  auVar104 = vsubps_avx(auVar104,auVar102);
  auVar2 = vfmadd213ps_fma(auVar104,auVar91,auVar102);
  auVar104 = vcvtdq2ps_avx512vl(auVar87);
  auVar102 = vcvtdq2ps_avx512vl(auVar88);
  auVar102 = vsubps_avx(auVar102,auVar104);
  auVar83 = vfmadd213ps_fma(auVar102,auVar91,auVar104);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x14 + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x18 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar102);
  auVar105 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x1d + 6));
  auVar82 = vfmadd213ps_fma(auVar104,auVar91,auVar102);
  auVar102 = vcvtdq2ps_avx(auVar105);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x21 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar102);
  auVar77 = vfmadd213ps_fma(auVar104,auVar91,auVar102);
  auVar102 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x1f + 6));
  auVar102 = vcvtdq2ps_avx(auVar102);
  auVar104 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar73 * 0x23 + 6));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar104 = vsubps_avx(auVar104,auVar102);
  auVar79 = vfmadd213ps_fma(auVar104,auVar91,auVar102);
  auVar102 = vsubps_avx512vl(ZEXT1632(auVar78),auVar101);
  auVar106._4_4_ = auVar76._4_4_ * auVar102._4_4_;
  auVar106._0_4_ = auVar76._0_4_ * auVar102._0_4_;
  auVar106._8_4_ = auVar76._8_4_ * auVar102._8_4_;
  auVar106._12_4_ = auVar76._12_4_ * auVar102._12_4_;
  auVar106._16_4_ = auVar102._16_4_ * 0.0;
  auVar106._20_4_ = auVar102._20_4_ * 0.0;
  auVar106._24_4_ = auVar102._24_4_ * 0.0;
  auVar106._28_4_ = auVar102._28_4_;
  auVar102 = vsubps_avx512vl(ZEXT1632(auVar2),auVar101);
  auVar88._0_4_ = auVar76._0_4_ * auVar102._0_4_;
  auVar88._4_4_ = auVar76._4_4_ * auVar102._4_4_;
  auVar88._8_4_ = auVar76._8_4_ * auVar102._8_4_;
  auVar88._12_4_ = auVar76._12_4_ * auVar102._12_4_;
  auVar88._16_4_ = auVar102._16_4_ * 0.0;
  auVar88._20_4_ = auVar102._20_4_ * 0.0;
  auVar88._24_4_ = auVar102._24_4_ * 0.0;
  auVar88._28_4_ = 0;
  auVar102 = vsubps_avx(ZEXT1632(auVar83),auVar103);
  auVar107._4_4_ = auVar75._4_4_ * auVar102._4_4_;
  auVar107._0_4_ = auVar75._0_4_ * auVar102._0_4_;
  auVar107._8_4_ = auVar75._8_4_ * auVar102._8_4_;
  auVar107._12_4_ = auVar75._12_4_ * auVar102._12_4_;
  auVar107._16_4_ = auVar102._16_4_ * 0.0;
  auVar107._20_4_ = auVar102._20_4_ * 0.0;
  auVar107._24_4_ = auVar102._24_4_ * 0.0;
  auVar107._28_4_ = auVar102._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(auVar82),auVar103);
  auVar87._0_4_ = auVar75._0_4_ * auVar102._0_4_;
  auVar87._4_4_ = auVar75._4_4_ * auVar102._4_4_;
  auVar87._8_4_ = auVar75._8_4_ * auVar102._8_4_;
  auVar87._12_4_ = auVar75._12_4_ * auVar102._12_4_;
  auVar87._16_4_ = auVar102._16_4_ * 0.0;
  auVar87._20_4_ = auVar102._20_4_ * 0.0;
  auVar87._24_4_ = auVar102._24_4_ * 0.0;
  auVar87._28_4_ = 0;
  auVar102 = vsubps_avx(ZEXT1632(auVar77),ZEXT1632(auVar80));
  auVar108._4_4_ = auVar84._4_4_ * auVar102._4_4_;
  auVar108._0_4_ = auVar84._0_4_ * auVar102._0_4_;
  auVar108._8_4_ = auVar84._8_4_ * auVar102._8_4_;
  auVar108._12_4_ = auVar84._12_4_ * auVar102._12_4_;
  auVar108._16_4_ = auVar102._16_4_ * 0.0;
  auVar108._20_4_ = auVar102._20_4_ * 0.0;
  auVar108._24_4_ = auVar102._24_4_ * 0.0;
  auVar108._28_4_ = auVar102._28_4_;
  auVar102 = vsubps_avx(ZEXT1632(auVar79),ZEXT1632(auVar80));
  auVar86._0_4_ = auVar84._0_4_ * auVar102._0_4_;
  auVar86._4_4_ = auVar84._4_4_ * auVar102._4_4_;
  auVar86._8_4_ = auVar84._8_4_ * auVar102._8_4_;
  auVar86._12_4_ = auVar84._12_4_ * auVar102._12_4_;
  auVar86._16_4_ = auVar102._16_4_ * 0.0;
  auVar86._20_4_ = auVar102._20_4_ * 0.0;
  auVar86._24_4_ = auVar102._24_4_ * 0.0;
  auVar86._28_4_ = 0;
  auVar102 = vpminsd_avx2(auVar106,auVar88);
  auVar104 = vpminsd_avx2(auVar107,auVar87);
  auVar102 = vmaxps_avx(auVar102,auVar104);
  auVar104 = vpminsd_avx2(auVar108,auVar86);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar105._4_4_ = uVar163;
  auVar105._0_4_ = uVar163;
  auVar105._8_4_ = uVar163;
  auVar105._12_4_ = uVar163;
  auVar105._16_4_ = uVar163;
  auVar105._20_4_ = uVar163;
  auVar105._24_4_ = uVar163;
  auVar105._28_4_ = uVar163;
  auVar104 = vmaxps_avx512vl(auVar104,auVar105);
  auVar102 = vmaxps_avx(auVar102,auVar104);
  auVar104._8_4_ = 0x3f7ffffa;
  auVar104._0_8_ = 0x3f7ffffa3f7ffffa;
  auVar104._12_4_ = 0x3f7ffffa;
  auVar104._16_4_ = 0x3f7ffffa;
  auVar104._20_4_ = 0x3f7ffffa;
  auVar104._24_4_ = 0x3f7ffffa;
  auVar104._28_4_ = 0x3f7ffffa;
  local_300 = vmulps_avx512vl(auVar102,auVar104);
  auVar102 = vpmaxsd_avx2(auVar106,auVar88);
  auVar104 = vpmaxsd_avx2(auVar107,auVar87);
  auVar102 = vminps_avx(auVar102,auVar104);
  auVar104 = vpmaxsd_avx2(auVar108,auVar86);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar103._4_4_ = uVar163;
  auVar103._0_4_ = uVar163;
  auVar103._8_4_ = uVar163;
  auVar103._12_4_ = uVar163;
  auVar103._16_4_ = uVar163;
  auVar103._20_4_ = uVar163;
  auVar103._24_4_ = uVar163;
  auVar103._28_4_ = uVar163;
  auVar104 = vminps_avx512vl(auVar104,auVar103);
  auVar102 = vminps_avx(auVar102,auVar104);
  auVar99._8_4_ = 0x3f800003;
  auVar99._0_8_ = 0x3f8000033f800003;
  auVar99._12_4_ = 0x3f800003;
  auVar99._16_4_ = 0x3f800003;
  auVar99._20_4_ = 0x3f800003;
  auVar99._24_4_ = 0x3f800003;
  auVar99._28_4_ = 0x3f800003;
  auVar102 = vmulps_avx512vl(auVar102,auVar99);
  uVar18 = vcmpps_avx512vl(local_300,auVar102,2);
  uVar20 = vpcmpgtd_avx512vl(auVar85,_DAT_01fb4ba0);
  local_608 = (ulong)(byte)((byte)uVar18 & (byte)uVar20);
  local_550 = vpmovm2d_avx512vl((ulong)(uint)(1 << ((uint)k & 0x1f)));
  local_610 = prim;
LAB_01b28b84:
  if (local_608 == 0) {
LAB_01b2b563:
    return local_608 != 0;
  }
  lVar66 = 0;
  for (uVar68 = local_608; (uVar68 & 1) == 0; uVar68 = uVar68 >> 1 | 0x8000000000000000) {
    lVar66 = lVar66 + 1;
  }
  local_778 = (ulong)*(uint *)(local_610 + 2);
  pGVar3 = (context->scene->geometries).items[local_778].ptr;
  uVar68 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           (ulong)*(uint *)(local_610 + lVar66 * 4 + 6) *
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar236 = (pGVar3->time_range).lower;
  fVar236 = pGVar3->fnumTimeSegments *
            ((*(float *)(ray + k * 4 + 0x70) - fVar236) / ((pGVar3->time_range).upper - fVar236));
  auVar76 = vroundss_avx(ZEXT416((uint)fVar236),ZEXT416((uint)fVar236),9);
  auVar76 = vminss_avx(auVar76,ZEXT416((uint)(pGVar3->fnumTimeSegments + -1.0)));
  auVar76 = vmaxss_avx(ZEXT816(0) << 0x20,auVar76);
  fVar236 = fVar236 - auVar76._0_4_;
  _Var4 = pGVar3[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar71 = (long)(int)auVar76._0_4_ * 0x38;
  lVar66 = *(long *)(_Var4 + 0x10 + lVar71);
  lVar5 = *(long *)(_Var4 + 0x38 + lVar71);
  lVar6 = *(long *)(_Var4 + 0x48 + lVar71);
  pfVar1 = (float *)(lVar5 + uVar68 * lVar6);
  auVar142._0_4_ = fVar236 * *pfVar1;
  auVar142._4_4_ = fVar236 * pfVar1[1];
  auVar142._8_4_ = fVar236 * pfVar1[2];
  auVar142._12_4_ = fVar236 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar68 + 1) * lVar6);
  auVar164._0_4_ = fVar236 * *pfVar1;
  auVar164._4_4_ = fVar236 * pfVar1[1];
  auVar164._8_4_ = fVar236 * pfVar1[2];
  auVar164._12_4_ = fVar236 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + (uVar68 + 2) * lVar6);
  auVar182._0_4_ = fVar236 * *pfVar1;
  auVar182._4_4_ = fVar236 * pfVar1[1];
  auVar182._8_4_ = fVar236 * pfVar1[2];
  auVar182._12_4_ = fVar236 * pfVar1[3];
  pfVar1 = (float *)(lVar5 + lVar6 * (uVar68 + 3));
  auVar205._0_4_ = fVar236 * *pfVar1;
  auVar205._4_4_ = fVar236 * pfVar1[1];
  auVar205._8_4_ = fVar236 * pfVar1[2];
  auVar205._12_4_ = fVar236 * pfVar1[3];
  lVar5 = *(long *)(_Var4 + lVar71);
  fVar236 = 1.0 - fVar236;
  auVar216._4_4_ = fVar236;
  auVar216._0_4_ = fVar236;
  auVar216._8_4_ = fVar236;
  auVar216._12_4_ = fVar236;
  auVar84 = vfmadd231ps_fma(auVar142,auVar216,*(undefined1 (*) [16])(lVar5 + lVar66 * uVar68));
  auVar78 = vfmadd231ps_fma(auVar164,auVar216,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar68 + 1)))
  ;
  auVar2 = vfmadd231ps_fma(auVar182,auVar216,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar68 + 2)));
  auVar83 = vfmadd231ps_fma(auVar205,auVar216,*(undefined1 (*) [16])(lVar5 + lVar66 * (uVar68 + 3)))
  ;
  auVar76 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),
                          0x1c);
  auVar75 = vinsertps_avx(auVar76,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar246._4_4_ = uVar163;
  auVar246._0_4_ = uVar163;
  auVar246._8_4_ = uVar163;
  auVar246._12_4_ = uVar163;
  local_440._16_4_ = uVar163;
  local_440._0_16_ = auVar246;
  local_440._20_4_ = uVar163;
  local_440._24_4_ = uVar163;
  local_440._28_4_ = uVar163;
  auVar251 = ZEXT3264(local_440);
  uVar163 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar252._4_4_ = uVar163;
  auVar252._0_4_ = uVar163;
  auVar252._8_4_ = uVar163;
  auVar252._12_4_ = uVar163;
  local_460._16_4_ = uVar163;
  local_460._0_16_ = auVar252;
  local_460._20_4_ = uVar163;
  local_460._24_4_ = uVar163;
  local_460._28_4_ = uVar163;
  auVar76 = vunpcklps_avx(auVar246,auVar252);
  fVar236 = *(float *)(ray + k * 4 + 0x60);
  auVar253._4_4_ = fVar236;
  auVar253._0_4_ = fVar236;
  auVar253._8_4_ = fVar236;
  auVar253._12_4_ = fVar236;
  local_480._16_4_ = fVar236;
  local_480._0_16_ = auVar253;
  local_480._20_4_ = fVar236;
  local_480._24_4_ = fVar236;
  local_480._28_4_ = fVar236;
  local_6f0 = vinsertps_avx(auVar76,auVar253,0x28);
  auVar226._0_4_ = auVar84._0_4_ + auVar78._0_4_ + auVar2._0_4_ + auVar83._0_4_;
  auVar226._4_4_ = auVar84._4_4_ + auVar78._4_4_ + auVar2._4_4_ + auVar83._4_4_;
  auVar226._8_4_ = auVar84._8_4_ + auVar78._8_4_ + auVar2._8_4_ + auVar83._8_4_;
  auVar226._12_4_ = auVar84._12_4_ + auVar78._12_4_ + auVar2._12_4_ + auVar83._12_4_;
  auVar81._8_4_ = 0x3e800000;
  auVar81._0_8_ = 0x3e8000003e800000;
  auVar81._12_4_ = 0x3e800000;
  auVar76 = vmulps_avx512vl(auVar226,auVar81);
  auVar76 = vsubps_avx(auVar76,auVar75);
  auVar76 = vdpps_avx(auVar76,local_6f0,0x7f);
  local_530 = vpbroadcastd_avx512vl();
  local_700 = vdpps_avx(local_6f0,local_6f0,0x7f);
  fVar16 = *(float *)(ray + k * 4 + 0x30);
  auVar245 = ZEXT464((uint)fVar16);
  auVar231._4_12_ = ZEXT812(0) << 0x20;
  auVar231._0_4_ = local_700._0_4_;
  auVar77 = vrcp14ss_avx512f(ZEXT816(0) << 0x40,auVar231);
  auVar82 = vfnmadd213ss_fma(auVar77,local_700,ZEXT416(0x40000000));
  local_2e0 = auVar76._0_4_ * auVar77._0_4_ * auVar82._0_4_;
  auVar229 = ZEXT3264(_DAT_01f7b040);
  auVar233._4_4_ = local_2e0;
  auVar233._0_4_ = local_2e0;
  auVar233._8_4_ = local_2e0;
  auVar233._12_4_ = local_2e0;
  fStack_3f0 = local_2e0;
  _local_400 = auVar233;
  fStack_3ec = local_2e0;
  fStack_3e8 = local_2e0;
  fStack_3e4 = local_2e0;
  auVar76 = vfmadd231ps_fma(auVar75,local_6f0,auVar233);
  auVar76 = vblendps_avx(auVar76,ZEXT816(0) << 0x40,8);
  auVar75 = vsubps_avx(auVar84,auVar76);
  auVar235 = ZEXT1664(auVar75);
  auVar84 = vsubps_avx(auVar2,auVar76);
  auVar238 = ZEXT1664(auVar84);
  auVar78 = vsubps_avx(auVar78,auVar76);
  auVar241 = ZEXT1664(auVar78);
  auVar76 = vsubps_avx(auVar83,auVar76);
  auVar102 = vbroadcastss_avx512vl(auVar75);
  auVar98._8_4_ = 1;
  auVar98._0_8_ = 0x100000001;
  auVar98._12_4_ = 1;
  auVar98._16_4_ = 1;
  auVar98._20_4_ = 1;
  auVar98._24_4_ = 1;
  auVar98._28_4_ = 1;
  local_680 = ZEXT1632(auVar75);
  auVar104 = vpermps_avx512vl(auVar98,local_680);
  auVar256 = ZEXT3264(auVar104);
  auVar110._8_4_ = 2;
  auVar110._0_8_ = 0x200000002;
  auVar110._12_4_ = 2;
  auVar110._16_4_ = 2;
  auVar110._20_4_ = 2;
  auVar110._24_4_ = 2;
  auVar110._28_4_ = 2;
  auVar105 = vpermps_avx512vl(auVar110,local_680);
  auVar257 = ZEXT3264(auVar105);
  auVar111._8_4_ = 3;
  auVar111._0_8_ = 0x300000003;
  auVar111._12_4_ = 3;
  auVar111._16_4_ = 3;
  auVar111._20_4_ = 3;
  auVar111._24_4_ = 3;
  auVar111._28_4_ = 3;
  auVar103 = vpermps_avx512vl(auVar111,local_680);
  auVar258 = ZEXT3264(auVar103);
  auVar99 = vbroadcastss_avx512vl(auVar78);
  local_6c0 = ZEXT1632(auVar78);
  auVar100 = vpermps_avx512vl(auVar98,local_6c0);
  auVar101 = vpermps_avx512vl(auVar110,local_6c0);
  auVar94 = vpermps_avx512vl(auVar111,local_6c0);
  local_820 = vbroadcastss_avx512vl(auVar84);
  auVar259 = ZEXT3264(local_820);
  local_6a0 = ZEXT1632(auVar84);
  local_840 = vpermps_avx512vl(auVar98,local_6a0);
  auVar260 = ZEXT3264(local_840);
  local_860 = vpermps_avx512vl(auVar110,local_6a0);
  auVar261 = ZEXT3264(local_860);
  auVar95 = vpermps_avx512vl(auVar111,local_6a0);
  local_260 = vbroadcastss_avx512vl(auVar76);
  _local_6e0 = ZEXT1632(auVar76);
  local_240 = vpermps_avx512vl(auVar98,_local_6e0);
  local_2a0 = vpermps_avx2(auVar110,_local_6e0);
  local_2c0 = vpermps_avx2(auVar111,_local_6e0);
  auVar76 = vfmadd231ps_fma(ZEXT432((uint)(fVar236 * fVar236)),local_460,local_460);
  auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_440,local_440);
  local_220._0_4_ = auVar76._0_4_;
  local_220._4_4_ = local_220._0_4_;
  local_220._8_4_ = local_220._0_4_;
  local_220._12_4_ = local_220._0_4_;
  local_220._16_4_ = local_220._0_4_;
  local_220._20_4_ = local_220._0_4_;
  local_220._24_4_ = local_220._0_4_;
  local_220._28_4_ = local_220._0_4_;
  auVar85._8_4_ = 0x7fffffff;
  auVar85._0_8_ = 0x7fffffff7fffffff;
  auVar85._12_4_ = 0x7fffffff;
  auVar85._16_4_ = 0x7fffffff;
  auVar85._20_4_ = 0x7fffffff;
  auVar85._24_4_ = 0x7fffffff;
  auVar85._28_4_ = 0x7fffffff;
  vandps_avx512vl(local_220,auVar85);
  local_660 = ZEXT416((uint)local_2e0);
  local_2e0 = fVar16 - local_2e0;
  fStack_2dc = local_2e0;
  fStack_2d8 = local_2e0;
  fStack_2d4 = local_2e0;
  fStack_2d0 = local_2e0;
  fStack_2cc = local_2e0;
  fStack_2c8 = local_2e0;
  fStack_2c4 = local_2e0;
  uVar68 = 0;
  bVar65 = 0;
  local_a20 = 1;
  local_540 = vpbroadcastd_avx512vl();
  auVar76 = vsqrtss_avx(local_700,local_700);
  local_864 = auVar76._0_4_;
  auVar76 = vsqrtss_avx(local_700,local_700);
  local_868 = auVar76._0_4_;
  local_390 = ZEXT816(0x3f80000000000000);
  auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
  auVar263 = ZEXT3264(auVar106);
  local_280 = local_240;
  do {
    auVar76 = vmovshdup_avx(local_390);
    auVar76 = vsubps_avx(auVar76,local_390);
    auVar143._0_4_ = auVar76._0_4_;
    fVar17 = auVar143._0_4_ * 0.04761905;
    uVar163 = local_390._0_4_;
    auVar221._4_4_ = uVar163;
    auVar221._0_4_ = uVar163;
    auVar221._8_4_ = uVar163;
    auVar221._12_4_ = uVar163;
    auVar221._16_4_ = uVar163;
    auVar221._20_4_ = uVar163;
    auVar221._24_4_ = uVar163;
    auVar221._28_4_ = uVar163;
    auVar143._4_4_ = auVar143._0_4_;
    auVar143._8_4_ = auVar143._0_4_;
    auVar143._12_4_ = auVar143._0_4_;
    local_720._16_4_ = auVar143._0_4_;
    local_720._0_16_ = auVar143;
    local_720._20_4_ = auVar143._0_4_;
    local_720._24_4_ = auVar143._0_4_;
    local_720._28_4_ = auVar143._0_4_;
    auVar76 = vfmadd231ps_fma(auVar221,local_720,auVar229._0_32_);
    auVar262 = auVar263._0_32_;
    auVar107 = vsubps_avx512vl(auVar262,ZEXT1632(auVar76));
    fVar236 = auVar107._0_4_;
    fVar239 = auVar107._4_4_;
    fVar213 = auVar107._8_4_;
    fVar215 = auVar107._12_4_;
    fVar225 = auVar107._16_4_;
    fVar181 = auVar107._20_4_;
    fVar15 = auVar107._24_4_;
    fVar141 = fVar236 * fVar236 * fVar236;
    fVar157 = fVar239 * fVar239 * fVar239;
    auVar116._4_4_ = fVar157;
    auVar116._0_4_ = fVar141;
    fVar158 = fVar213 * fVar213 * fVar213;
    auVar116._8_4_ = fVar158;
    fVar159 = fVar215 * fVar215 * fVar215;
    auVar116._12_4_ = fVar159;
    fVar160 = fVar225 * fVar225 * fVar225;
    auVar116._16_4_ = fVar160;
    fVar161 = fVar181 * fVar181 * fVar181;
    auVar116._20_4_ = fVar161;
    fVar162 = fVar15 * fVar15 * fVar15;
    auVar116._24_4_ = fVar162;
    auVar116._28_4_ = auVar143._0_4_;
    auVar87 = vbroadcastss_avx512vl(ZEXT416(0x40800000));
    auVar106 = vmulps_avx512vl(auVar116,auVar87);
    fVar254 = auVar76._0_4_;
    fVar240 = auVar76._4_4_;
    fVar214 = auVar76._8_4_;
    fVar224 = auVar76._12_4_;
    fVar180 = fVar254 * fVar254 * fVar254;
    fVar202 = fVar240 * fVar240 * fVar240;
    fVar203 = fVar214 * fVar214 * fVar214;
    fVar204 = fVar224 * fVar224 * fVar224;
    auVar242._0_4_ = fVar254 * fVar236;
    auVar242._4_4_ = fVar240 * fVar239;
    auVar242._8_4_ = fVar214 * fVar213;
    auVar242._12_4_ = fVar224 * fVar215;
    auVar242._16_4_ = fVar225 * 0.0;
    auVar242._20_4_ = fVar181 * 0.0;
    auVar242._28_36_ = auVar241._28_36_;
    auVar242._24_4_ = fVar15 * 0.0;
    auVar108 = vmulps_avx512vl(ZEXT1632(CONCAT412(fVar204,CONCAT48(fVar203,CONCAT44(fVar202,fVar180)
                                                                  ))),auVar87);
    fVar244 = auVar108._28_4_ + auVar143._0_4_;
    fVar35 = auVar245._28_4_;
    fVar230 = fVar244 + fVar35 + auVar229._28_4_;
    auVar117._4_4_ = fVar157 * 0.16666667;
    auVar117._0_4_ = fVar141 * 0.16666667;
    auVar117._8_4_ = fVar158 * 0.16666667;
    auVar117._12_4_ = fVar159 * 0.16666667;
    auVar117._16_4_ = fVar160 * 0.16666667;
    auVar117._20_4_ = fVar161 * 0.16666667;
    auVar117._24_4_ = fVar162 * 0.16666667;
    auVar117._28_4_ = fVar244;
    auVar118._4_4_ =
         (auVar242._4_4_ * fVar239 * 12.0 + auVar242._4_4_ * fVar240 * 6.0 +
         fVar202 + auVar106._4_4_) * 0.16666667;
    auVar118._0_4_ =
         (auVar242._0_4_ * fVar236 * 12.0 + auVar242._0_4_ * fVar254 * 6.0 +
         fVar180 + auVar106._0_4_) * 0.16666667;
    auVar118._8_4_ =
         (auVar242._8_4_ * fVar213 * 12.0 + auVar242._8_4_ * fVar214 * 6.0 +
         fVar203 + auVar106._8_4_) * 0.16666667;
    auVar118._12_4_ =
         (auVar242._12_4_ * fVar215 * 12.0 + auVar242._12_4_ * fVar224 * 6.0 +
         fVar204 + auVar106._12_4_) * 0.16666667;
    auVar118._16_4_ =
         (auVar242._16_4_ * fVar225 * 12.0 + auVar242._16_4_ * 0.0 * 6.0 + auVar106._16_4_ + 0.0) *
         0.16666667;
    auVar118._20_4_ =
         (auVar242._20_4_ * fVar181 * 12.0 + auVar242._20_4_ * 0.0 * 6.0 + auVar106._20_4_ + 0.0) *
         0.16666667;
    auVar118._24_4_ =
         (auVar242._24_4_ * fVar15 * 12.0 + auVar242._24_4_ * 0.0 * 6.0 + auVar106._24_4_ + 0.0) *
         0.16666667;
    auVar118._28_4_ = fVar35;
    auVar119._4_4_ =
         (auVar108._4_4_ + fVar157 +
         auVar242._4_4_ * fVar240 * 12.0 + auVar242._4_4_ * fVar239 * 6.0) * 0.16666667;
    auVar119._0_4_ =
         (auVar108._0_4_ + fVar141 +
         auVar242._0_4_ * fVar254 * 12.0 + auVar242._0_4_ * fVar236 * 6.0) * 0.16666667;
    auVar119._8_4_ =
         (auVar108._8_4_ + fVar158 +
         auVar242._8_4_ * fVar214 * 12.0 + auVar242._8_4_ * fVar213 * 6.0) * 0.16666667;
    auVar119._12_4_ =
         (auVar108._12_4_ + fVar159 +
         auVar242._12_4_ * fVar224 * 12.0 + auVar242._12_4_ * fVar215 * 6.0) * 0.16666667;
    auVar119._16_4_ =
         (auVar108._16_4_ + fVar160 + auVar242._16_4_ * 0.0 * 12.0 + auVar242._16_4_ * fVar225 * 6.0
         ) * 0.16666667;
    auVar119._20_4_ =
         (auVar108._20_4_ + fVar161 + auVar242._20_4_ * 0.0 * 12.0 + auVar242._20_4_ * fVar181 * 6.0
         ) * 0.16666667;
    auVar119._24_4_ =
         (auVar108._24_4_ + fVar162 + auVar242._24_4_ * 0.0 * 12.0 + auVar242._24_4_ * fVar15 * 6.0)
         * 0.16666667;
    auVar119._28_4_ = auVar251._28_4_;
    fVar180 = fVar180 * 0.16666667;
    fVar202 = fVar202 * 0.16666667;
    fVar203 = fVar203 * 0.16666667;
    fVar204 = fVar204 * 0.16666667;
    auVar120._28_4_ = fVar230;
    auVar120._0_28_ = ZEXT1628(CONCAT412(fVar204,CONCAT48(fVar203,CONCAT44(fVar202,fVar180))));
    auVar106 = vmulps_avx512vl(local_260,auVar120);
    auVar108 = vmulps_avx512vl(local_280,auVar120);
    auVar123._4_4_ = local_2a0._4_4_ * fVar202;
    auVar123._0_4_ = local_2a0._0_4_ * fVar180;
    auVar123._8_4_ = local_2a0._8_4_ * fVar203;
    auVar123._12_4_ = local_2a0._12_4_ * fVar204;
    auVar123._16_4_ = local_2a0._16_4_ * 0.0;
    auVar123._20_4_ = local_2a0._20_4_ * 0.0;
    auVar123._24_4_ = local_2a0._24_4_ * 0.0;
    auVar123._28_4_ = auVar143._0_4_;
    auVar124._4_4_ = local_2c0._4_4_ * fVar202;
    auVar124._0_4_ = local_2c0._0_4_ * fVar180;
    auVar124._8_4_ = local_2c0._8_4_ * fVar203;
    auVar124._12_4_ = local_2c0._12_4_ * fVar204;
    auVar124._16_4_ = local_2c0._16_4_ * 0.0;
    auVar124._20_4_ = local_2c0._20_4_ * 0.0;
    auVar124._24_4_ = local_2c0._24_4_ * 0.0;
    auVar124._28_4_ = fVar230;
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar119,auVar259._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar119,auVar260._0_32_);
    auVar85 = vfmadd231ps_avx512vl(auVar123,auVar119,auVar261._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar124,auVar95,auVar119);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar118,auVar99);
    auVar108 = vfmadd231ps_avx512vl(auVar108,auVar118,auVar100);
    auVar85 = vfmadd231ps_avx512vl(auVar85,auVar118,auVar101);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar94,auVar118);
    auVar88 = vfmadd231ps_avx512vl(auVar106,auVar117,auVar102);
    auVar89 = vfmadd231ps_avx512vl(auVar108,auVar117,auVar256._0_32_);
    auVar90 = vfmadd231ps_avx512vl(auVar85,auVar117,auVar257._0_32_);
    auVar108 = vfmadd231ps_avx512vl(auVar86,auVar258._0_32_,auVar117);
    auVar85 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
    auVar86 = vxorps_avx512vl(auVar107,auVar85);
    auVar106 = vxorps_avx512vl(ZEXT1632(auVar76),auVar85);
    auVar222._0_4_ = auVar106._0_4_ * fVar254;
    auVar222._4_4_ = auVar106._4_4_ * fVar240;
    auVar222._8_4_ = auVar106._8_4_ * fVar214;
    auVar222._12_4_ = auVar106._12_4_ * fVar224;
    auVar222._16_4_ = auVar106._16_4_ * 0.0;
    auVar222._20_4_ = auVar106._20_4_ * 0.0;
    auVar222._24_4_ = auVar106._24_4_ * 0.0;
    auVar222._28_4_ = 0;
    auVar91 = vmulps_avx512vl(auVar242._0_32_,auVar87);
    auVar106 = vsubps_avx(auVar222,auVar91);
    auVar36._4_4_ = auVar86._4_4_ * fVar239 * 0.5;
    auVar36._0_4_ = auVar86._0_4_ * fVar236 * 0.5;
    auVar36._8_4_ = auVar86._8_4_ * fVar213 * 0.5;
    auVar36._12_4_ = auVar86._12_4_ * fVar215 * 0.5;
    auVar36._16_4_ = auVar86._16_4_ * fVar225 * 0.5;
    auVar36._20_4_ = auVar86._20_4_ * fVar181 * 0.5;
    auVar36._24_4_ = auVar86._24_4_ * fVar15 * 0.5;
    auVar36._28_4_ = auVar107._28_4_;
    auVar37._4_4_ = auVar106._4_4_ * 0.5;
    auVar37._0_4_ = auVar106._0_4_ * 0.5;
    auVar37._8_4_ = auVar106._8_4_ * 0.5;
    auVar37._12_4_ = auVar106._12_4_ * 0.5;
    auVar37._16_4_ = auVar106._16_4_ * 0.5;
    auVar37._20_4_ = auVar106._20_4_ * 0.5;
    auVar37._24_4_ = auVar106._24_4_ * 0.5;
    auVar37._28_4_ = auVar106._28_4_;
    auVar38._4_4_ = (auVar91._4_4_ + fVar239 * fVar239) * 0.5;
    auVar38._0_4_ = (auVar91._0_4_ + fVar236 * fVar236) * 0.5;
    auVar38._8_4_ = (auVar91._8_4_ + fVar213 * fVar213) * 0.5;
    auVar38._12_4_ = (auVar91._12_4_ + fVar215 * fVar215) * 0.5;
    auVar38._16_4_ = (auVar91._16_4_ + fVar225 * fVar225) * 0.5;
    auVar38._20_4_ = (auVar91._20_4_ + fVar181 * fVar181) * 0.5;
    auVar38._24_4_ = (auVar91._24_4_ + fVar15 * fVar15) * 0.5;
    auVar38._28_4_ = auVar91._28_4_ + auVar235._28_4_;
    fVar236 = fVar254 * fVar254 * 0.5;
    fVar254 = fVar240 * fVar240 * 0.5;
    fVar239 = fVar214 * fVar214 * 0.5;
    fVar240 = fVar224 * fVar224 * 0.5;
    auVar39._28_4_ = auVar238._28_4_;
    auVar39._0_28_ = ZEXT1628(CONCAT412(fVar240,CONCAT48(fVar239,CONCAT44(fVar254,fVar236))));
    auVar106 = vmulps_avx512vl(local_260,auVar39);
    auVar107 = vmulps_avx512vl(local_280,auVar39);
    auVar40._4_4_ = local_2a0._4_4_ * fVar254;
    auVar40._0_4_ = local_2a0._0_4_ * fVar236;
    auVar40._8_4_ = local_2a0._8_4_ * fVar239;
    auVar40._12_4_ = local_2a0._12_4_ * fVar240;
    auVar40._16_4_ = local_2a0._16_4_ * 0.0;
    auVar40._20_4_ = local_2a0._20_4_ * 0.0;
    auVar40._24_4_ = local_2a0._24_4_ * 0.0;
    auVar40._28_4_ = fVar35;
    auVar41._4_4_ = fVar254 * local_2c0._4_4_;
    auVar41._0_4_ = fVar236 * local_2c0._0_4_;
    auVar41._8_4_ = fVar239 * local_2c0._8_4_;
    auVar41._12_4_ = fVar240 * local_2c0._12_4_;
    auVar41._16_4_ = local_2c0._16_4_ * 0.0;
    auVar41._20_4_ = local_2c0._20_4_ * 0.0;
    auVar41._24_4_ = local_2c0._24_4_ * 0.0;
    auVar41._28_4_ = auVar238._28_4_;
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar38,auVar259._0_32_);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar38,auVar260._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar40,auVar38,auVar261._0_32_);
    auVar76 = vfmadd231ps_fma(auVar41,auVar95,auVar38);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar37,auVar99);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar37,auVar100);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar37,auVar101);
    auVar91 = vfmadd231ps_avx512vl(ZEXT1632(auVar76),auVar94,auVar37);
    auVar106 = vfmadd231ps_avx512vl(auVar106,auVar36,auVar102);
    auVar107 = vfmadd231ps_avx512vl(auVar107,auVar36,auVar256._0_32_);
    auVar86 = vfmadd231ps_avx512vl(auVar86,auVar36,auVar257._0_32_);
    auVar91 = vfmadd231ps_avx512vl(auVar91,auVar258._0_32_,auVar36);
    auVar42._4_4_ = auVar106._4_4_ * fVar17;
    auVar42._0_4_ = auVar106._0_4_ * fVar17;
    auVar42._8_4_ = auVar106._8_4_ * fVar17;
    auVar42._12_4_ = auVar106._12_4_ * fVar17;
    auVar42._16_4_ = auVar106._16_4_ * fVar17;
    auVar42._20_4_ = auVar106._20_4_ * fVar17;
    auVar42._24_4_ = auVar106._24_4_ * fVar17;
    auVar42._28_4_ = auVar95._28_4_;
    auVar251 = ZEXT3264(auVar42);
    auVar43._4_4_ = auVar107._4_4_ * fVar17;
    auVar43._0_4_ = auVar107._0_4_ * fVar17;
    auVar43._8_4_ = auVar107._8_4_ * fVar17;
    auVar43._12_4_ = auVar107._12_4_ * fVar17;
    auVar43._16_4_ = auVar107._16_4_ * fVar17;
    auVar43._20_4_ = auVar107._20_4_ * fVar17;
    auVar43._24_4_ = auVar107._24_4_ * fVar17;
    auVar43._28_4_ = 0x3e2aaaab;
    auVar44._4_4_ = auVar86._4_4_ * fVar17;
    auVar44._0_4_ = auVar86._0_4_ * fVar17;
    auVar44._8_4_ = auVar86._8_4_ * fVar17;
    auVar44._12_4_ = auVar86._12_4_ * fVar17;
    auVar44._16_4_ = auVar86._16_4_ * fVar17;
    auVar44._20_4_ = auVar86._20_4_ * fVar17;
    auVar44._24_4_ = auVar86._24_4_ * fVar17;
    auVar44._28_4_ = 0x40c00000;
    fVar236 = auVar91._0_4_ * fVar17;
    fVar254 = auVar91._4_4_ * fVar17;
    auVar45._4_4_ = fVar254;
    auVar45._0_4_ = fVar236;
    fVar239 = auVar91._8_4_ * fVar17;
    auVar45._8_4_ = fVar239;
    fVar240 = auVar91._12_4_ * fVar17;
    auVar45._12_4_ = fVar240;
    fVar213 = auVar91._16_4_ * fVar17;
    auVar45._16_4_ = fVar213;
    fVar214 = auVar91._20_4_ * fVar17;
    auVar45._20_4_ = fVar214;
    fVar215 = auVar91._24_4_ * fVar17;
    auVar45._24_4_ = fVar215;
    auVar45._28_4_ = fVar17;
    auVar76 = vxorps_avx512vl(auVar85._0_16_,auVar85._0_16_);
    auVar91 = vpermt2ps_avx512vl(auVar88,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar241 = ZEXT3264(auVar91);
    auVar92 = vpermt2ps_avx512vl(auVar89,_DAT_01fb9fc0,ZEXT1632(auVar76));
    auVar85 = ZEXT1632(auVar76);
    auVar93 = vpermt2ps_avx512vl(auVar90,_DAT_01fb9fc0,auVar85);
    auVar245 = ZEXT3264(auVar93);
    auVar223._0_4_ = fVar236 + auVar108._0_4_;
    auVar223._4_4_ = fVar254 + auVar108._4_4_;
    auVar223._8_4_ = fVar239 + auVar108._8_4_;
    auVar223._12_4_ = fVar240 + auVar108._12_4_;
    auVar223._16_4_ = fVar213 + auVar108._16_4_;
    auVar223._20_4_ = fVar214 + auVar108._20_4_;
    auVar223._24_4_ = fVar215 + auVar108._24_4_;
    auVar223._28_4_ = fVar17 + auVar108._28_4_;
    auVar106 = vmaxps_avx(auVar108,auVar223);
    auVar107 = vminps_avx(auVar108,auVar223);
    auVar96 = vpermt2ps_avx512vl(auVar108,_DAT_01fb9fc0,auVar85);
    auVar97 = vpermt2ps_avx512vl(auVar42,_DAT_01fb9fc0,auVar85);
    auVar98 = vpermt2ps_avx512vl(auVar43,_DAT_01fb9fc0,auVar85);
    auVar120 = ZEXT1632(auVar76);
    auVar109 = vpermt2ps_avx512vl(auVar44,_DAT_01fb9fc0,auVar120);
    auVar108 = vpermt2ps_avx512vl(auVar45,_DAT_01fb9fc0,auVar120);
    auVar110 = vsubps_avx512vl(auVar96,auVar108);
    auVar108 = vsubps_avx(auVar91,auVar88);
    auVar238 = ZEXT3264(auVar108);
    auVar85 = vsubps_avx(auVar92,auVar89);
    auVar235 = ZEXT3264(auVar85);
    auVar86 = vsubps_avx(auVar93,auVar90);
    auVar111 = vmulps_avx512vl(auVar85,auVar44);
    auVar111 = vfmsub231ps_avx512vl(auVar111,auVar43,auVar86);
    auVar112 = vmulps_avx512vl(auVar86,auVar42);
    auVar112 = vfmsub231ps_avx512vl(auVar112,auVar44,auVar108);
    auVar113 = vmulps_avx512vl(auVar108,auVar43);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar42,auVar85);
    auVar113 = vmulps_avx512vl(auVar113,auVar113);
    auVar112 = vfmadd231ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar111,auVar111);
    auVar112 = vmulps_avx512vl(auVar86,auVar86);
    auVar112 = vfmadd231ps_avx512vl(auVar112,auVar85,auVar85);
    auVar114 = vfmadd231ps_avx512vl(auVar112,auVar108,auVar108);
    auVar112 = vrcp14ps_avx512vl(auVar114);
    auVar113 = vfnmadd213ps_avx512vl(auVar112,auVar114,auVar262);
    auVar112 = vfmadd132ps_avx512vl(auVar113,auVar112,auVar112);
    auVar111 = vmulps_avx512vl(auVar111,auVar112);
    auVar113 = vmulps_avx512vl(auVar85,auVar109);
    auVar113 = vfmsub231ps_avx512vl(auVar113,auVar98,auVar86);
    auVar115 = vmulps_avx512vl(auVar86,auVar97);
    auVar115 = vfmsub231ps_avx512vl(auVar115,auVar109,auVar108);
    auVar116 = vmulps_avx512vl(auVar108,auVar98);
    auVar116 = vfmsub231ps_avx512vl(auVar116,auVar97,auVar85);
    auVar116 = vmulps_avx512vl(auVar116,auVar116);
    auVar115 = vfmadd231ps_avx512vl(auVar116,auVar115,auVar115);
    auVar113 = vfmadd231ps_avx512vl(auVar115,auVar113,auVar113);
    auVar112 = vmulps_avx512vl(auVar113,auVar112);
    auVar111 = vmaxps_avx512vl(auVar111,auVar112);
    auVar111 = vsqrtps_avx512vl(auVar111);
    auVar112 = vmaxps_avx512vl(auVar110,auVar96);
    auVar106 = vmaxps_avx512vl(auVar106,auVar112);
    auVar116 = vaddps_avx512vl(auVar111,auVar106);
    auVar106 = vminps_avx512vl(auVar110,auVar96);
    auVar106 = vminps_avx(auVar107,auVar106);
    auVar106 = vsubps_avx512vl(auVar106,auVar111);
    auVar112._8_4_ = 0x3f800002;
    auVar112._0_8_ = 0x3f8000023f800002;
    auVar112._12_4_ = 0x3f800002;
    auVar112._16_4_ = 0x3f800002;
    auVar112._20_4_ = 0x3f800002;
    auVar112._24_4_ = 0x3f800002;
    auVar112._28_4_ = 0x3f800002;
    auVar107 = vmulps_avx512vl(auVar116,auVar112);
    auVar113._8_4_ = 0x3f7ffffc;
    auVar113._0_8_ = 0x3f7ffffc3f7ffffc;
    auVar113._12_4_ = 0x3f7ffffc;
    auVar113._16_4_ = 0x3f7ffffc;
    auVar113._20_4_ = 0x3f7ffffc;
    auVar113._24_4_ = 0x3f7ffffc;
    auVar113._28_4_ = 0x3f7ffffc;
    auVar106 = vmulps_avx512vl(auVar106,auVar113);
    auVar107 = vmulps_avx512vl(auVar107,auVar107);
    auVar96 = vrsqrt14ps_avx512vl(auVar114);
    auVar115._8_4_ = 0xbf000000;
    auVar115._0_8_ = 0xbf000000bf000000;
    auVar115._12_4_ = 0xbf000000;
    auVar115._16_4_ = 0xbf000000;
    auVar115._20_4_ = 0xbf000000;
    auVar115._24_4_ = 0xbf000000;
    auVar115._28_4_ = 0xbf000000;
    auVar110 = vmulps_avx512vl(auVar114,auVar115);
    fVar236 = auVar96._0_4_;
    fVar254 = auVar96._4_4_;
    fVar239 = auVar96._8_4_;
    fVar240 = auVar96._12_4_;
    fVar213 = auVar96._16_4_;
    fVar214 = auVar96._20_4_;
    fVar215 = auVar96._24_4_;
    auVar46._4_4_ = fVar254 * fVar254 * fVar254 * auVar110._4_4_;
    auVar46._0_4_ = fVar236 * fVar236 * fVar236 * auVar110._0_4_;
    auVar46._8_4_ = fVar239 * fVar239 * fVar239 * auVar110._8_4_;
    auVar46._12_4_ = fVar240 * fVar240 * fVar240 * auVar110._12_4_;
    auVar46._16_4_ = fVar213 * fVar213 * fVar213 * auVar110._16_4_;
    auVar46._20_4_ = fVar214 * fVar214 * fVar214 * auVar110._20_4_;
    auVar46._24_4_ = fVar215 * fVar215 * fVar215 * auVar110._24_4_;
    auVar46._28_4_ = auVar116._28_4_;
    auVar114._8_4_ = 0x3fc00000;
    auVar114._0_8_ = 0x3fc000003fc00000;
    auVar114._12_4_ = 0x3fc00000;
    auVar114._16_4_ = 0x3fc00000;
    auVar114._20_4_ = 0x3fc00000;
    auVar114._24_4_ = 0x3fc00000;
    auVar114._28_4_ = 0x3fc00000;
    auVar96 = vfmadd231ps_avx512vl(auVar46,auVar96,auVar114);
    auVar110 = vmulps_avx512vl(auVar108,auVar96);
    auVar111 = vmulps_avx512vl(auVar85,auVar96);
    auVar112 = vmulps_avx512vl(auVar86,auVar96);
    auVar113 = vsubps_avx512vl(auVar120,auVar88);
    auVar115 = vsubps_avx512vl(auVar120,auVar89);
    auVar114 = vsubps_avx512vl(auVar120,auVar90);
    auVar116 = vmulps_avx512vl(local_480,auVar114);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_460,auVar115);
    auVar116 = vfmadd231ps_avx512vl(auVar116,local_440,auVar113);
    auVar117 = vmulps_avx512vl(auVar114,auVar114);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar115,auVar115);
    auVar117 = vfmadd231ps_avx512vl(auVar117,auVar113,auVar113);
    auVar118 = vmulps_avx512vl(local_480,auVar112);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar111,local_460);
    auVar118 = vfmadd231ps_avx512vl(auVar118,auVar110,local_440);
    auVar112 = vmulps_avx512vl(auVar114,auVar112);
    auVar111 = vfmadd231ps_avx512vl(auVar112,auVar115,auVar111);
    auVar110 = vfmadd231ps_avx512vl(auVar111,auVar113,auVar110);
    auVar111 = vmulps_avx512vl(auVar118,auVar118);
    auVar112 = vsubps_avx512vl(local_220,auVar111);
    auVar119 = vmulps_avx512vl(auVar118,auVar110);
    auVar116 = vsubps_avx512vl(auVar116,auVar119);
    auVar116 = vaddps_avx512vl(auVar116,auVar116);
    auVar119 = vmulps_avx512vl(auVar110,auVar110);
    local_740 = vsubps_avx512vl(auVar117,auVar119);
    auVar107 = vsubps_avx512vl(local_740,auVar107);
    local_7c0 = vmulps_avx512vl(auVar116,auVar116);
    _local_7e0 = vmulps_avx512vl(auVar112,auVar87);
    auVar87 = vmulps_avx512vl(_local_7e0,auVar107);
    auVar87 = vsubps_avx512vl(local_7c0,auVar87);
    uVar73 = vcmpps_avx512vl(auVar87,auVar120,5);
    bVar63 = (byte)uVar73;
    if (bVar63 == 0) {
LAB_01b29912:
      auVar229 = ZEXT3264(_DAT_01f7b040);
      auVar106 = vmovdqa64_avx512vl(auVar104);
      auVar256 = ZEXT3264(auVar106);
      auVar106 = vmovdqa64_avx512vl(auVar105);
      auVar257 = ZEXT3264(auVar106);
      auVar106 = vmovdqa64_avx512vl(auVar103);
      auVar258 = ZEXT3264(auVar106);
      auVar259 = ZEXT3264(local_820);
      auVar260 = ZEXT3264(local_840);
      auVar261 = ZEXT3264(local_860);
    }
    else {
      auVar87 = vsqrtps_avx512vl(auVar87);
      auVar117 = vaddps_avx512vl(auVar112,auVar112);
      local_800 = vrcp14ps_avx512vl(auVar117);
      auVar119 = vfnmadd213ps_avx512vl(local_800,auVar117,auVar262);
      auVar119 = vfmadd132ps_avx512vl(auVar119,local_800,local_800);
      auVar262._8_4_ = 0x80000000;
      auVar262._0_8_ = 0x8000000080000000;
      auVar262._12_4_ = 0x80000000;
      auVar262._16_4_ = 0x80000000;
      auVar262._20_4_ = 0x80000000;
      auVar262._24_4_ = 0x80000000;
      auVar262._28_4_ = 0x80000000;
      _local_5a0 = vxorps_avx512vl(auVar116,auVar262);
      auVar120 = vsubps_avx512vl(_local_5a0,auVar87);
      local_580 = vmulps_avx512vl(auVar120,auVar119);
      auVar87 = vsubps_avx512vl(auVar87,auVar116);
      local_5c0 = vmulps_avx512vl(auVar87,auVar119);
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
      auVar119 = vblendmps_avx512vl(auVar87,local_580);
      auVar121._0_4_ =
           (uint)(bVar63 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar87._0_4_;
      bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar121._4_4_ = (uint)bVar72 * auVar119._4_4_ | (uint)!bVar72 * auVar87._4_4_;
      bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar121._8_4_ = (uint)bVar72 * auVar119._8_4_ | (uint)!bVar72 * auVar87._8_4_;
      bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar121._12_4_ = (uint)bVar72 * auVar119._12_4_ | (uint)!bVar72 * auVar87._12_4_;
      bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar121._16_4_ = (uint)bVar72 * auVar119._16_4_ | (uint)!bVar72 * auVar87._16_4_;
      bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar121._20_4_ = (uint)bVar72 * auVar119._20_4_ | (uint)!bVar72 * auVar87._20_4_;
      bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar121._24_4_ = (uint)bVar72 * auVar119._24_4_ | (uint)!bVar72 * auVar87._24_4_;
      bVar72 = SUB81(uVar73 >> 7,0);
      auVar121._28_4_ = (uint)bVar72 * auVar119._28_4_ | (uint)!bVar72 * auVar87._28_4_;
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
      auVar119 = vblendmps_avx512vl(auVar87,local_5c0);
      auVar122._0_4_ =
           (uint)(bVar63 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar63 & 1) * auVar87._0_4_;
      bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
      auVar122._4_4_ = (uint)bVar72 * auVar119._4_4_ | (uint)!bVar72 * auVar87._4_4_;
      bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
      auVar122._8_4_ = (uint)bVar72 * auVar119._8_4_ | (uint)!bVar72 * auVar87._8_4_;
      bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
      auVar122._12_4_ = (uint)bVar72 * auVar119._12_4_ | (uint)!bVar72 * auVar87._12_4_;
      bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
      auVar122._16_4_ = (uint)bVar72 * auVar119._16_4_ | (uint)!bVar72 * auVar87._16_4_;
      bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
      auVar122._20_4_ = (uint)bVar72 * auVar119._20_4_ | (uint)!bVar72 * auVar87._20_4_;
      bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
      auVar122._24_4_ = (uint)bVar72 * auVar119._24_4_ | (uint)!bVar72 * auVar87._24_4_;
      bVar72 = SUB81(uVar73 >> 7,0);
      auVar122._28_4_ = (uint)bVar72 * auVar119._28_4_ | (uint)!bVar72 * auVar87._28_4_;
      auVar87 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
      vandps_avx512vl(auVar111,auVar87);
      local_5e0 = vmaxps_avx512vl(local_240,auVar87);
      auVar28._8_4_ = 0x36000000;
      auVar28._0_8_ = 0x3600000036000000;
      auVar28._12_4_ = 0x36000000;
      auVar28._16_4_ = 0x36000000;
      auVar28._20_4_ = 0x36000000;
      auVar28._24_4_ = 0x36000000;
      auVar28._28_4_ = 0x36000000;
      local_600 = vmulps_avx512vl(local_5e0,auVar28);
      vandps_avx512vl(auVar112,auVar87);
      uVar69 = vcmpps_avx512vl(local_600,local_600,1);
      uVar73 = uVar73 & uVar69;
      bVar70 = (byte)uVar73;
      if (bVar70 != 0) {
        uVar69 = vcmpps_avx512vl(auVar107,_DAT_01f7b000,2);
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x7f800000));
        auVar87 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
        auVar111 = vblendmps_avx512vl(auVar107,auVar87);
        bVar67 = (byte)uVar69;
        uVar74 = (uint)(bVar67 & 1) * auVar111._0_4_ | (uint)!(bool)(bVar67 & 1) * local_600._0_4_;
        bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
        uVar134 = (uint)bVar72 * auVar111._4_4_ | (uint)!bVar72 * local_600._4_4_;
        bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
        uVar135 = (uint)bVar72 * auVar111._8_4_ | (uint)!bVar72 * local_600._8_4_;
        bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
        uVar136 = (uint)bVar72 * auVar111._12_4_ | (uint)!bVar72 * local_600._12_4_;
        bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
        uVar137 = (uint)bVar72 * auVar111._16_4_ | (uint)!bVar72 * local_600._16_4_;
        bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
        uVar138 = (uint)bVar72 * auVar111._20_4_ | (uint)!bVar72 * local_600._20_4_;
        bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
        uVar139 = (uint)bVar72 * auVar111._24_4_ | (uint)!bVar72 * local_600._24_4_;
        bVar72 = SUB81(uVar69 >> 7,0);
        uVar140 = (uint)bVar72 * auVar111._28_4_ | (uint)!bVar72 * local_600._28_4_;
        auVar121._0_4_ = (bVar70 & 1) * uVar74 | !(bool)(bVar70 & 1) * auVar121._0_4_;
        bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar121._4_4_ = bVar72 * uVar134 | !bVar72 * auVar121._4_4_;
        bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar121._8_4_ = bVar72 * uVar135 | !bVar72 * auVar121._8_4_;
        bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar121._12_4_ = bVar72 * uVar136 | !bVar72 * auVar121._12_4_;
        bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar121._16_4_ = bVar72 * uVar137 | !bVar72 * auVar121._16_4_;
        bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar121._20_4_ = bVar72 * uVar138 | !bVar72 * auVar121._20_4_;
        bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar121._24_4_ = bVar72 * uVar139 | !bVar72 * auVar121._24_4_;
        bVar72 = SUB81(uVar73 >> 7,0);
        auVar121._28_4_ = bVar72 * uVar140 | !bVar72 * auVar121._28_4_;
        auVar107 = vblendmps_avx512vl(auVar87,auVar107);
        bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
        bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
        bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
        bVar11 = (bool)((byte)(uVar69 >> 4) & 1);
        bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
        bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
        bVar14 = SUB81(uVar69 >> 7,0);
        auVar122._0_4_ =
             (uint)(bVar70 & 1) *
             ((uint)(bVar67 & 1) * auVar107._0_4_ | !(bool)(bVar67 & 1) * uVar74) |
             !(bool)(bVar70 & 1) * auVar122._0_4_;
        bVar8 = (bool)((byte)(uVar73 >> 1) & 1);
        auVar122._4_4_ =
             (uint)bVar8 * ((uint)bVar72 * auVar107._4_4_ | !bVar72 * uVar134) |
             !bVar8 * auVar122._4_4_;
        bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
        auVar122._8_4_ =
             (uint)bVar72 * ((uint)bVar9 * auVar107._8_4_ | !bVar9 * uVar135) |
             !bVar72 * auVar122._8_4_;
        bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
        auVar122._12_4_ =
             (uint)bVar72 * ((uint)bVar10 * auVar107._12_4_ | !bVar10 * uVar136) |
             !bVar72 * auVar122._12_4_;
        bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
        auVar122._16_4_ =
             (uint)bVar72 * ((uint)bVar11 * auVar107._16_4_ | !bVar11 * uVar137) |
             !bVar72 * auVar122._16_4_;
        bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
        auVar122._20_4_ =
             (uint)bVar72 * ((uint)bVar12 * auVar107._20_4_ | !bVar12 * uVar138) |
             !bVar72 * auVar122._20_4_;
        bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
        auVar122._24_4_ =
             (uint)bVar72 * ((uint)bVar13 * auVar107._24_4_ | !bVar13 * uVar139) |
             !bVar72 * auVar122._24_4_;
        bVar72 = SUB81(uVar73 >> 7,0);
        auVar122._28_4_ =
             (uint)bVar72 * ((uint)bVar14 * auVar107._28_4_ | !bVar14 * uVar140) |
             !bVar72 * auVar122._28_4_;
        bVar63 = (~bVar70 | bVar67) & bVar63;
      }
      if ((bVar63 & 0x7f) == 0) {
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar263 = ZEXT3264(auVar106);
        auVar229 = ZEXT3264(_DAT_01f7b040);
        auVar106 = vmovdqa64_avx512vl(auVar104);
        auVar256 = ZEXT3264(auVar106);
        auVar106 = vmovdqa64_avx512vl(auVar105);
        auVar257 = ZEXT3264(auVar106);
        auVar106 = vmovdqa64_avx512vl(auVar103);
        auVar258 = ZEXT3264(auVar106);
        auVar259 = ZEXT3264(local_820);
        auVar260 = ZEXT3264(local_840);
        auVar261 = ZEXT3264(local_860);
      }
      else {
        auVar107 = vbroadcastss_avx512vl(ZEXT416(0x80000000));
        auVar87 = vxorps_avx512vl(auVar109,auVar107);
        auVar97 = vxorps_avx512vl(auVar97,auVar107);
        auVar229 = ZEXT464(*(uint *)(ray + k * 4 + 0x80));
        auVar98 = vxorps_avx512vl(auVar98,auVar107);
        auVar76 = vsubss_avx512f(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                                 ZEXT416((uint)local_660._0_4_));
        auVar109 = vbroadcastss_avx512vl(auVar76);
        auVar109 = vminps_avx512vl(auVar109,auVar122);
        auVar62._4_4_ = fStack_2dc;
        auVar62._0_4_ = local_2e0;
        auVar62._8_4_ = fStack_2d8;
        auVar62._12_4_ = fStack_2d4;
        auVar62._16_4_ = fStack_2d0;
        auVar62._20_4_ = fStack_2cc;
        auVar62._24_4_ = fStack_2c8;
        auVar62._28_4_ = fStack_2c4;
        auVar111 = vmaxps_avx512vl(auVar62,auVar121);
        auVar112 = vmulps_avx512vl(auVar44,auVar114);
        auVar112 = vfmadd213ps_avx512vl(auVar115,auVar43,auVar112);
        auVar76 = vfmadd213ps_fma(auVar113,auVar42,auVar112);
        auVar112 = vmulps_avx512vl(local_480,auVar44);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_460,auVar43);
        auVar112 = vfmadd231ps_avx512vl(auVar112,local_440,auVar42);
        auVar113 = vbroadcastss_avx512vl(ZEXT416(0x7fffffff));
        vandps_avx512vl(auVar112,auVar113);
        auVar115 = vbroadcastss_avx512vl(ZEXT416(0x219392ef));
        uVar18 = vcmpps_avx512vl(auVar113,auVar115,1);
        auVar114 = vxorps_avx512vl(ZEXT1632(auVar76),auVar107);
        auVar119 = vrcp14ps_avx512vl(auVar112);
        auVar120 = vxorps_avx512vl(auVar112,auVar107);
        auVar123 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar124 = vfnmadd213ps_avx512vl(auVar119,auVar112,auVar123);
        auVar76 = vfmadd132ps_fma(auVar124,auVar119,auVar119);
        fVar236 = auVar76._0_4_ * auVar114._0_4_;
        fVar254 = auVar76._4_4_ * auVar114._4_4_;
        auVar47._4_4_ = fVar254;
        auVar47._0_4_ = fVar236;
        fVar239 = auVar76._8_4_ * auVar114._8_4_;
        auVar47._8_4_ = fVar239;
        fVar240 = auVar76._12_4_ * auVar114._12_4_;
        auVar47._12_4_ = fVar240;
        fVar213 = auVar114._16_4_ * 0.0;
        auVar47._16_4_ = fVar213;
        fVar214 = auVar114._20_4_ * 0.0;
        auVar47._20_4_ = fVar214;
        fVar215 = auVar114._24_4_ * 0.0;
        auVar47._24_4_ = fVar215;
        auVar47._28_4_ = auVar114._28_4_;
        uVar20 = vcmpps_avx512vl(auVar112,auVar120,1);
        bVar70 = (byte)uVar18 | (byte)uVar20;
        auVar249._8_4_ = 0xff800000;
        auVar249._0_8_ = 0xff800000ff800000;
        auVar249._12_4_ = 0xff800000;
        auVar249._16_4_ = 0xff800000;
        auVar249._20_4_ = 0xff800000;
        auVar249._24_4_ = 0xff800000;
        auVar249._28_4_ = 0xff800000;
        auVar119 = vblendmps_avx512vl(auVar47,auVar249);
        auVar125._0_4_ = (uint)(bVar70 & 1) * auVar119._0_4_ | (uint)!(bool)(bVar70 & 1) * -0x800000
        ;
        bVar72 = (bool)(bVar70 >> 1 & 1);
        auVar125._4_4_ = (uint)bVar72 * auVar119._4_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)(bVar70 >> 2 & 1);
        auVar125._8_4_ = (uint)bVar72 * auVar119._8_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)(bVar70 >> 3 & 1);
        auVar125._12_4_ = (uint)bVar72 * auVar119._12_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)(bVar70 >> 4 & 1);
        auVar125._16_4_ = (uint)bVar72 * auVar119._16_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)(bVar70 >> 5 & 1);
        auVar125._20_4_ = (uint)bVar72 * auVar119._20_4_ | (uint)!bVar72 * -0x800000;
        bVar72 = (bool)(bVar70 >> 6 & 1);
        auVar125._24_4_ = (uint)bVar72 * auVar119._24_4_ | (uint)!bVar72 * -0x800000;
        auVar125._28_4_ =
             (uint)(bVar70 >> 7) * auVar119._28_4_ | (uint)!(bool)(bVar70 >> 7) * -0x800000;
        auVar119 = vmaxps_avx512vl(auVar111,auVar125);
        auVar251 = ZEXT3264(auVar119);
        uVar20 = vcmpps_avx512vl(auVar112,auVar120,6);
        bVar70 = (byte)uVar18 | (byte)uVar20;
        auVar126._0_4_ = (uint)(bVar70 & 1) * 0x7f800000 | (uint)!(bool)(bVar70 & 1) * (int)fVar236;
        bVar72 = (bool)(bVar70 >> 1 & 1);
        auVar126._4_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar254;
        bVar72 = (bool)(bVar70 >> 2 & 1);
        auVar126._8_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar239;
        bVar72 = (bool)(bVar70 >> 3 & 1);
        auVar126._12_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar240;
        bVar72 = (bool)(bVar70 >> 4 & 1);
        auVar126._16_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar213;
        bVar72 = (bool)(bVar70 >> 5 & 1);
        auVar126._20_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar214;
        bVar72 = (bool)(bVar70 >> 6 & 1);
        auVar126._24_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar215;
        auVar126._28_4_ =
             (uint)(bVar70 >> 7) * 0x7f800000 | (uint)!(bool)(bVar70 >> 7) * auVar114._28_4_;
        auVar109 = vminps_avx512vl(auVar109,auVar126);
        auVar76 = vxorps_avx512vl(auVar111._0_16_,auVar111._0_16_);
        auVar91 = vsubps_avx512vl(ZEXT1632(auVar76),auVar91);
        auVar92 = vsubps_avx512vl(ZEXT1632(auVar76),auVar92);
        auVar111 = ZEXT1632(auVar76);
        auVar93 = vsubps_avx512vl(auVar111,auVar93);
        auVar93 = vmulps_avx512vl(auVar93,auVar87);
        auVar92 = vfmadd231ps_avx512vl(auVar93,auVar98,auVar92);
        auVar91 = vfmadd231ps_avx512vl(auVar92,auVar97,auVar91);
        auVar87 = vmulps_avx512vl(local_480,auVar87);
        auVar87 = vfmadd231ps_avx512vl(auVar87,local_460,auVar98);
        auVar263 = ZEXT3264(auVar123);
        auVar87 = vfmadd231ps_avx512vl(auVar87,local_440,auVar97);
        vandps_avx512vl(auVar87,auVar113);
        uVar18 = vcmpps_avx512vl(auVar87,auVar115,1);
        auVar91 = vxorps_avx512vl(auVar91,auVar107);
        auVar92 = vrcp14ps_avx512vl(auVar87);
        auVar107 = vxorps_avx512vl(auVar87,auVar107);
        auVar245 = ZEXT3264(auVar107);
        auVar93 = vfnmadd213ps_avx512vl(auVar92,auVar87,auVar123);
        auVar76 = vfmadd132ps_fma(auVar93,auVar92,auVar92);
        fVar236 = auVar76._0_4_ * auVar91._0_4_;
        fVar254 = auVar76._4_4_ * auVar91._4_4_;
        auVar48._4_4_ = fVar254;
        auVar48._0_4_ = fVar236;
        fVar239 = auVar76._8_4_ * auVar91._8_4_;
        auVar48._8_4_ = fVar239;
        fVar240 = auVar76._12_4_ * auVar91._12_4_;
        auVar48._12_4_ = fVar240;
        fVar213 = auVar91._16_4_ * 0.0;
        auVar48._16_4_ = fVar213;
        fVar214 = auVar91._20_4_ * 0.0;
        auVar48._20_4_ = fVar214;
        fVar215 = auVar91._24_4_ * 0.0;
        auVar48._24_4_ = fVar215;
        auVar48._28_4_ = auVar91._28_4_;
        uVar20 = vcmpps_avx512vl(auVar87,auVar107,1);
        bVar70 = (byte)uVar18 | (byte)uVar20;
        auVar29._8_4_ = 0xff800000;
        auVar29._0_8_ = 0xff800000ff800000;
        auVar29._12_4_ = 0xff800000;
        auVar29._16_4_ = 0xff800000;
        auVar29._20_4_ = 0xff800000;
        auVar29._24_4_ = 0xff800000;
        auVar29._28_4_ = 0xff800000;
        auVar93 = vblendmps_avx512vl(auVar48,auVar29);
        auVar127._0_4_ =
             (uint)(bVar70 & 1) * auVar93._0_4_ | (uint)!(bool)(bVar70 & 1) * auVar92._0_4_;
        bVar72 = (bool)(bVar70 >> 1 & 1);
        auVar127._4_4_ = (uint)bVar72 * auVar93._4_4_ | (uint)!bVar72 * auVar92._4_4_;
        bVar72 = (bool)(bVar70 >> 2 & 1);
        auVar127._8_4_ = (uint)bVar72 * auVar93._8_4_ | (uint)!bVar72 * auVar92._8_4_;
        bVar72 = (bool)(bVar70 >> 3 & 1);
        auVar127._12_4_ = (uint)bVar72 * auVar93._12_4_ | (uint)!bVar72 * auVar92._12_4_;
        bVar72 = (bool)(bVar70 >> 4 & 1);
        auVar127._16_4_ = (uint)bVar72 * auVar93._16_4_ | (uint)!bVar72 * auVar92._16_4_;
        bVar72 = (bool)(bVar70 >> 5 & 1);
        auVar127._20_4_ = (uint)bVar72 * auVar93._20_4_ | (uint)!bVar72 * auVar92._20_4_;
        bVar72 = (bool)(bVar70 >> 6 & 1);
        auVar127._24_4_ = (uint)bVar72 * auVar93._24_4_ | (uint)!bVar72 * auVar92._24_4_;
        auVar127._28_4_ =
             (uint)(bVar70 >> 7) * auVar93._28_4_ | (uint)!(bool)(bVar70 >> 7) * auVar92._28_4_;
        local_420 = vmaxps_avx(auVar119,auVar127);
        uVar20 = vcmpps_avx512vl(auVar87,auVar107,6);
        bVar70 = (byte)uVar18 | (byte)uVar20;
        auVar128._0_4_ = (uint)(bVar70 & 1) * 0x7f800000 | (uint)!(bool)(bVar70 & 1) * (int)fVar236;
        bVar72 = (bool)(bVar70 >> 1 & 1);
        auVar128._4_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar254;
        bVar72 = (bool)(bVar70 >> 2 & 1);
        auVar128._8_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar239;
        bVar72 = (bool)(bVar70 >> 3 & 1);
        auVar128._12_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar240;
        bVar72 = (bool)(bVar70 >> 4 & 1);
        auVar128._16_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar213;
        bVar72 = (bool)(bVar70 >> 5 & 1);
        auVar128._20_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar214;
        bVar72 = (bool)(bVar70 >> 6 & 1);
        auVar128._24_4_ = (uint)bVar72 * 0x7f800000 | (uint)!bVar72 * (int)fVar215;
        auVar128._28_4_ =
             (uint)(bVar70 >> 7) * 0x7f800000 | (uint)!(bool)(bVar70 >> 7) * auVar91._28_4_;
        local_340 = vminps_avx(auVar109,auVar128);
        auVar241 = ZEXT3264(local_340);
        uVar18 = vcmpps_avx512vl(local_420,local_340,2);
        bVar63 = bVar63 & 0x7f & (byte)uVar18;
        if (bVar63 == 0) goto LAB_01b29912;
        auVar107 = vmaxps_avx512vl(auVar111,auVar106);
        auVar106 = vfmadd213ps_avx512vl(local_580,auVar118,auVar110);
        fVar236 = auVar96._0_4_;
        fVar254 = auVar96._4_4_;
        auVar49._4_4_ = fVar254 * auVar106._4_4_;
        auVar49._0_4_ = fVar236 * auVar106._0_4_;
        fVar239 = auVar96._8_4_;
        auVar49._8_4_ = fVar239 * auVar106._8_4_;
        fVar240 = auVar96._12_4_;
        auVar49._12_4_ = fVar240 * auVar106._12_4_;
        fVar213 = auVar96._16_4_;
        auVar49._16_4_ = fVar213 * auVar106._16_4_;
        fVar214 = auVar96._20_4_;
        auVar49._20_4_ = fVar214 * auVar106._20_4_;
        fVar215 = auVar96._24_4_;
        auVar49._24_4_ = fVar215 * auVar106._24_4_;
        auVar49._28_4_ = auVar106._28_4_;
        auVar106 = vfmadd213ps_avx512vl(local_5c0,auVar118,auVar110);
        auVar50._4_4_ = fVar254 * auVar106._4_4_;
        auVar50._0_4_ = fVar236 * auVar106._0_4_;
        auVar50._8_4_ = fVar239 * auVar106._8_4_;
        auVar50._12_4_ = fVar240 * auVar106._12_4_;
        auVar50._16_4_ = fVar213 * auVar106._16_4_;
        auVar50._20_4_ = fVar214 * auVar106._20_4_;
        auVar50._24_4_ = fVar215 * auVar106._24_4_;
        auVar50._28_4_ = auVar106._28_4_;
        auVar106 = vminps_avx512vl(auVar49,auVar123);
        auVar57 = ZEXT812(0);
        auVar87 = ZEXT1232(auVar57) << 0x20;
        auVar106 = vmaxps_avx(auVar106,ZEXT1232(auVar57) << 0x20);
        auVar91 = vminps_avx512vl(auVar50,auVar123);
        auVar51._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
        auVar51._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
        auVar51._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
        auVar51._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
        auVar51._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
        auVar51._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
        auVar51._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
        auVar51._28_4_ = auVar106._28_4_ + 7.0;
        local_1e0 = vfmadd213ps_avx512vl(auVar51,local_720,auVar221);
        auVar106 = vmaxps_avx(auVar91,ZEXT1232(auVar57) << 0x20);
        auVar52._4_4_ = (auVar106._4_4_ + 1.0) * 0.125;
        auVar52._0_4_ = (auVar106._0_4_ + 0.0) * 0.125;
        auVar52._8_4_ = (auVar106._8_4_ + 2.0) * 0.125;
        auVar52._12_4_ = (auVar106._12_4_ + 3.0) * 0.125;
        auVar52._16_4_ = (auVar106._16_4_ + 4.0) * 0.125;
        auVar52._20_4_ = (auVar106._20_4_ + 5.0) * 0.125;
        auVar52._24_4_ = (auVar106._24_4_ + 6.0) * 0.125;
        auVar52._28_4_ = auVar106._28_4_ + 7.0;
        local_200 = vfmadd213ps_avx512vl(auVar52,local_720,auVar221);
        auVar53._4_4_ = auVar107._4_4_ * auVar107._4_4_;
        auVar53._0_4_ = auVar107._0_4_ * auVar107._0_4_;
        auVar53._8_4_ = auVar107._8_4_ * auVar107._8_4_;
        auVar53._12_4_ = auVar107._12_4_ * auVar107._12_4_;
        auVar53._16_4_ = auVar107._16_4_ * auVar107._16_4_;
        auVar53._20_4_ = auVar107._20_4_ * auVar107._20_4_;
        auVar53._24_4_ = auVar107._24_4_ * auVar107._24_4_;
        auVar53._28_4_ = auVar107._28_4_;
        auVar106 = vsubps_avx(local_740,auVar53);
        auVar54._4_4_ = auVar106._4_4_ * (float)local_7e0._4_4_;
        auVar54._0_4_ = auVar106._0_4_ * (float)local_7e0._0_4_;
        auVar54._8_4_ = auVar106._8_4_ * fStack_7d8;
        auVar54._12_4_ = auVar106._12_4_ * fStack_7d4;
        auVar54._16_4_ = auVar106._16_4_ * fStack_7d0;
        auVar54._20_4_ = auVar106._20_4_ * fStack_7cc;
        auVar54._24_4_ = auVar106._24_4_ * fStack_7c8;
        auVar54._28_4_ = auVar107._28_4_;
        auVar107 = vsubps_avx(local_7c0,auVar54);
        uVar18 = vcmpps_avx512vl(auVar107,ZEXT1232(auVar57) << 0x20,5);
        bVar70 = (byte)uVar18;
        auVar259 = ZEXT3264(local_820);
        auVar260 = ZEXT3264(local_840);
        auVar261 = ZEXT3264(local_860);
        if (bVar70 == 0) {
          bVar70 = 0;
          auVar108 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar235 = ZEXT864(0) << 0x20;
          auVar107 = ZEXT1232(ZEXT812(0)) << 0x20;
          auVar91 = SUB6432(ZEXT864(0),0) << 0x20;
          auVar243 = SUB6428(ZEXT864(0),0) << 0x20;
          auVar129._8_4_ = 0x7f800000;
          auVar129._0_8_ = 0x7f8000007f800000;
          auVar129._12_4_ = 0x7f800000;
          auVar129._16_4_ = 0x7f800000;
          auVar129._20_4_ = 0x7f800000;
          auVar129._24_4_ = 0x7f800000;
          auVar129._28_4_ = 0x7f800000;
          auVar130._8_4_ = 0xff800000;
          auVar130._0_8_ = 0xff800000ff800000;
          auVar130._12_4_ = 0xff800000;
          auVar130._16_4_ = 0xff800000;
          auVar130._20_4_ = 0xff800000;
          auVar130._24_4_ = 0xff800000;
          auVar130._28_4_ = 0xff800000;
        }
        else {
          auVar75 = vxorps_avx512vl(auVar143,auVar143);
          uVar73 = vcmpps_avx512vl(auVar107,auVar111,5);
          auVar107 = vsqrtps_avx(auVar107);
          auVar87 = vfnmadd213ps_avx512vl(auVar117,local_800,auVar123);
          auVar92 = vfmadd132ps_avx512vl(auVar87,local_800,local_800);
          auVar87 = vsubps_avx(_local_5a0,auVar107);
          auVar93 = vmulps_avx512vl(auVar87,auVar92);
          auVar107 = vsubps_avx512vl(auVar107,auVar116);
          auVar92 = vmulps_avx512vl(auVar107,auVar92);
          auVar107 = vfmadd213ps_avx512vl(auVar118,auVar93,auVar110);
          auVar55._4_4_ = fVar254 * auVar107._4_4_;
          auVar55._0_4_ = fVar236 * auVar107._0_4_;
          auVar55._8_4_ = fVar239 * auVar107._8_4_;
          auVar55._12_4_ = fVar240 * auVar107._12_4_;
          auVar55._16_4_ = fVar213 * auVar107._16_4_;
          auVar55._20_4_ = fVar214 * auVar107._20_4_;
          auVar55._24_4_ = fVar215 * auVar107._24_4_;
          auVar55._28_4_ = auVar91._28_4_;
          auVar107 = vmulps_avx512vl(local_440,auVar93);
          auVar87 = vmulps_avx512vl(local_460,auVar93);
          auVar97 = vmulps_avx512vl(local_480,auVar93);
          auVar91 = vfmadd213ps_avx512vl(auVar108,auVar55,auVar88);
          auVar107 = vsubps_avx512vl(auVar107,auVar91);
          auVar91 = vfmadd213ps_avx512vl(auVar85,auVar55,auVar89);
          auVar91 = vsubps_avx512vl(auVar87,auVar91);
          auVar76 = vfmadd213ps_fma(auVar55,auVar86,auVar90);
          auVar87 = vsubps_avx(auVar97,ZEXT1632(auVar76));
          auVar243 = auVar87._0_28_;
          auVar87 = vfmadd213ps_avx512vl(auVar118,auVar92,auVar110);
          auVar96 = vmulps_avx512vl(auVar96,auVar87);
          auVar87 = vmulps_avx512vl(local_440,auVar92);
          auVar97 = vmulps_avx512vl(local_460,auVar92);
          auVar98 = vmulps_avx512vl(local_480,auVar92);
          auVar76 = vfmadd213ps_fma(auVar108,auVar96,auVar88);
          auVar87 = vsubps_avx(auVar87,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar85,auVar96,auVar89);
          auVar108 = vsubps_avx512vl(auVar97,ZEXT1632(auVar76));
          auVar76 = vfmadd213ps_fma(auVar86,auVar96,auVar90);
          auVar85 = vsubps_avx512vl(auVar98,ZEXT1632(auVar76));
          auVar235 = ZEXT3264(auVar85);
          auVar150._8_4_ = 0x7f800000;
          auVar150._0_8_ = 0x7f8000007f800000;
          auVar150._12_4_ = 0x7f800000;
          auVar150._16_4_ = 0x7f800000;
          auVar150._20_4_ = 0x7f800000;
          auVar150._24_4_ = 0x7f800000;
          auVar150._28_4_ = 0x7f800000;
          auVar85 = vblendmps_avx512vl(auVar150,auVar93);
          bVar72 = (bool)((byte)uVar73 & 1);
          auVar129._0_4_ = (uint)bVar72 * auVar85._0_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar129._4_4_ = (uint)bVar72 * auVar85._4_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar129._8_4_ = (uint)bVar72 * auVar85._8_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar129._12_4_ = (uint)bVar72 * auVar85._12_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar129._16_4_ = (uint)bVar72 * auVar85._16_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar129._20_4_ = (uint)bVar72 * auVar85._20_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar129._24_4_ = (uint)bVar72 * auVar85._24_4_ | (uint)!bVar72 * 0x7f800000;
          bVar72 = SUB81(uVar73 >> 7,0);
          auVar129._28_4_ = (uint)bVar72 * auVar85._28_4_ | (uint)!bVar72 * 0x7f800000;
          auVar199._8_4_ = 0xff800000;
          auVar199._0_8_ = 0xff800000ff800000;
          auVar199._12_4_ = 0xff800000;
          auVar199._16_4_ = 0xff800000;
          auVar199._20_4_ = 0xff800000;
          auVar199._24_4_ = 0xff800000;
          auVar199._28_4_ = 0xff800000;
          auVar85 = vblendmps_avx512vl(auVar199,auVar92);
          bVar72 = (bool)((byte)uVar73 & 1);
          auVar130._0_4_ = (uint)bVar72 * auVar85._0_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
          auVar130._4_4_ = (uint)bVar72 * auVar85._4_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
          auVar130._8_4_ = (uint)bVar72 * auVar85._8_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
          auVar130._12_4_ = (uint)bVar72 * auVar85._12_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
          auVar130._16_4_ = (uint)bVar72 * auVar85._16_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
          auVar130._20_4_ = (uint)bVar72 * auVar85._20_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
          auVar130._24_4_ = (uint)bVar72 * auVar85._24_4_ | (uint)!bVar72 * -0x800000;
          bVar72 = SUB81(uVar73 >> 7,0);
          auVar130._28_4_ = (uint)bVar72 * auVar85._28_4_ | (uint)!bVar72 * -0x800000;
          auVar30._8_4_ = 0x36000000;
          auVar30._0_8_ = 0x3600000036000000;
          auVar30._12_4_ = 0x36000000;
          auVar30._16_4_ = 0x36000000;
          auVar30._20_4_ = 0x36000000;
          auVar30._24_4_ = 0x36000000;
          auVar30._28_4_ = 0x36000000;
          auVar85 = vmulps_avx512vl(local_5e0,auVar30);
          uVar69 = vcmpps_avx512vl(auVar85,local_600,0xe);
          uVar73 = uVar73 & uVar69;
          bVar67 = (byte)uVar73;
          if (bVar67 != 0) {
            uVar69 = vcmpps_avx512vl(auVar106,ZEXT1632(auVar75),2);
            auVar237._8_4_ = 0x7f800000;
            auVar237._0_8_ = 0x7f8000007f800000;
            auVar237._12_4_ = 0x7f800000;
            auVar237._16_4_ = 0x7f800000;
            auVar237._20_4_ = 0x7f800000;
            auVar237._24_4_ = 0x7f800000;
            auVar237._28_4_ = 0x7f800000;
            auVar250._8_4_ = 0xff800000;
            auVar250._0_8_ = 0xff800000ff800000;
            auVar250._12_4_ = 0xff800000;
            auVar250._16_4_ = 0xff800000;
            auVar250._20_4_ = 0xff800000;
            auVar250._24_4_ = 0xff800000;
            auVar250._28_4_ = 0xff800000;
            auVar106 = vblendmps_avx512vl(auVar237,auVar250);
            bVar64 = (byte)uVar69;
            uVar74 = (uint)(bVar64 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar64 & 1) * auVar85._0_4_
            ;
            bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
            uVar134 = (uint)bVar72 * auVar106._4_4_ | (uint)!bVar72 * auVar85._4_4_;
            bVar72 = (bool)((byte)(uVar69 >> 2) & 1);
            uVar135 = (uint)bVar72 * auVar106._8_4_ | (uint)!bVar72 * auVar85._8_4_;
            bVar72 = (bool)((byte)(uVar69 >> 3) & 1);
            uVar136 = (uint)bVar72 * auVar106._12_4_ | (uint)!bVar72 * auVar85._12_4_;
            bVar72 = (bool)((byte)(uVar69 >> 4) & 1);
            uVar137 = (uint)bVar72 * auVar106._16_4_ | (uint)!bVar72 * auVar85._16_4_;
            bVar72 = (bool)((byte)(uVar69 >> 5) & 1);
            uVar138 = (uint)bVar72 * auVar106._20_4_ | (uint)!bVar72 * auVar85._20_4_;
            bVar72 = (bool)((byte)(uVar69 >> 6) & 1);
            uVar139 = (uint)bVar72 * auVar106._24_4_ | (uint)!bVar72 * auVar85._24_4_;
            bVar72 = SUB81(uVar69 >> 7,0);
            uVar140 = (uint)bVar72 * auVar106._28_4_ | (uint)!bVar72 * auVar85._28_4_;
            auVar129._0_4_ = (bVar67 & 1) * uVar74 | !(bool)(bVar67 & 1) * auVar129._0_4_;
            bVar72 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar129._4_4_ = bVar72 * uVar134 | !bVar72 * auVar129._4_4_;
            bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar129._8_4_ = bVar72 * uVar135 | !bVar72 * auVar129._8_4_;
            bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar129._12_4_ = bVar72 * uVar136 | !bVar72 * auVar129._12_4_;
            bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar129._16_4_ = bVar72 * uVar137 | !bVar72 * auVar129._16_4_;
            bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar129._20_4_ = bVar72 * uVar138 | !bVar72 * auVar129._20_4_;
            bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar129._24_4_ = bVar72 * uVar139 | !bVar72 * auVar129._24_4_;
            bVar72 = SUB81(uVar73 >> 7,0);
            auVar129._28_4_ = bVar72 * uVar140 | !bVar72 * auVar129._28_4_;
            auVar106 = vblendmps_avx512vl(auVar250,auVar237);
            bVar72 = (bool)((byte)(uVar69 >> 1) & 1);
            bVar9 = (bool)((byte)(uVar69 >> 2) & 1);
            bVar10 = (bool)((byte)(uVar69 >> 3) & 1);
            bVar11 = (bool)((byte)(uVar69 >> 4) & 1);
            bVar12 = (bool)((byte)(uVar69 >> 5) & 1);
            bVar13 = (bool)((byte)(uVar69 >> 6) & 1);
            bVar14 = SUB81(uVar69 >> 7,0);
            auVar130._0_4_ =
                 (uint)(bVar67 & 1) *
                 ((uint)(bVar64 & 1) * auVar106._0_4_ | !(bool)(bVar64 & 1) * uVar74) |
                 !(bool)(bVar67 & 1) * auVar130._0_4_;
            bVar8 = (bool)((byte)(uVar73 >> 1) & 1);
            auVar130._4_4_ =
                 (uint)bVar8 * ((uint)bVar72 * auVar106._4_4_ | !bVar72 * uVar134) |
                 !bVar8 * auVar130._4_4_;
            bVar72 = (bool)((byte)(uVar73 >> 2) & 1);
            auVar130._8_4_ =
                 (uint)bVar72 * ((uint)bVar9 * auVar106._8_4_ | !bVar9 * uVar135) |
                 !bVar72 * auVar130._8_4_;
            bVar72 = (bool)((byte)(uVar73 >> 3) & 1);
            auVar130._12_4_ =
                 (uint)bVar72 * ((uint)bVar10 * auVar106._12_4_ | !bVar10 * uVar136) |
                 !bVar72 * auVar130._12_4_;
            bVar72 = (bool)((byte)(uVar73 >> 4) & 1);
            auVar130._16_4_ =
                 (uint)bVar72 * ((uint)bVar11 * auVar106._16_4_ | !bVar11 * uVar137) |
                 !bVar72 * auVar130._16_4_;
            bVar72 = (bool)((byte)(uVar73 >> 5) & 1);
            auVar130._20_4_ =
                 (uint)bVar72 * ((uint)bVar12 * auVar106._20_4_ | !bVar12 * uVar138) |
                 !bVar72 * auVar130._20_4_;
            bVar72 = (bool)((byte)(uVar73 >> 6) & 1);
            auVar130._24_4_ =
                 (uint)bVar72 * ((uint)bVar13 * auVar106._24_4_ | !bVar13 * uVar139) |
                 !bVar72 * auVar130._24_4_;
            bVar72 = SUB81(uVar73 >> 7,0);
            auVar130._28_4_ =
                 (uint)bVar72 * ((uint)bVar14 * auVar106._28_4_ | !bVar14 * uVar140) |
                 !bVar72 * auVar130._28_4_;
            bVar70 = (~bVar67 | bVar64) & bVar70;
          }
        }
        auVar106 = vmovdqa64_avx512vl(auVar104);
        auVar256 = ZEXT3264(auVar106);
        auVar106 = vmovdqa64_avx512vl(auVar105);
        auVar257 = ZEXT3264(auVar106);
        auVar106 = vmovdqa64_avx512vl(auVar103);
        auVar258 = ZEXT3264(auVar106);
        auVar238._0_4_ = local_480._0_4_ * auVar235._0_4_;
        auVar238._4_4_ = local_480._4_4_ * auVar235._4_4_;
        auVar238._8_4_ = local_480._8_4_ * auVar235._8_4_;
        auVar238._12_4_ = local_480._12_4_ * auVar235._12_4_;
        auVar238._16_4_ = local_480._16_4_ * auVar235._16_4_;
        auVar238._20_4_ = local_480._20_4_ * auVar235._20_4_;
        auVar238._28_36_ = auVar235._28_36_;
        auVar238._24_4_ = local_480._24_4_ * auVar235._24_4_;
        auVar251 = ZEXT3264(local_460);
        auVar76 = vfmadd231ps_fma(auVar238._0_32_,local_460,auVar108);
        auVar238 = ZEXT3264(local_440);
        auVar76 = vfmadd231ps_fma(ZEXT1632(auVar76),local_440,auVar87);
        auVar234._8_4_ = 0x7fffffff;
        auVar234._0_8_ = 0x7fffffff7fffffff;
        auVar234._12_4_ = 0x7fffffff;
        auVar234._16_4_ = 0x7fffffff;
        auVar234._20_4_ = 0x7fffffff;
        auVar234._24_4_ = 0x7fffffff;
        auVar234._28_4_ = 0x7fffffff;
        auVar235 = ZEXT3264(auVar234);
        auVar106 = vandps_avx(ZEXT1632(auVar76),auVar234);
        auVar245 = ZEXT3264(local_420);
        _local_1c0 = local_420;
        auVar232._8_4_ = 0x3e99999a;
        auVar232._0_8_ = 0x3e99999a3e99999a;
        auVar232._12_4_ = 0x3e99999a;
        auVar232._16_4_ = 0x3e99999a;
        auVar232._20_4_ = 0x3e99999a;
        auVar232._24_4_ = 0x3e99999a;
        auVar232._28_4_ = 0x3e99999a;
        uVar18 = vcmpps_avx512vl(auVar106,auVar232,1);
        _local_360 = vmaxps_avx(local_420,auVar130);
        auVar106 = vminps_avx(local_340,auVar129);
        uVar20 = vcmpps_avx512vl(local_420,auVar106,2);
        bVar67 = (byte)uVar20 & bVar63;
        _local_3e0 = _local_360;
        uVar19 = vcmpps_avx512vl(_local_360,local_340,2);
        if ((bVar63 & ((byte)uVar19 | (byte)uVar20)) != 0) {
          local_870 = (uint)(byte)((byte)uVar18 | ~bVar70);
          auVar56._4_4_ = local_480._4_4_ * auVar243._4_4_;
          auVar56._0_4_ = local_480._0_4_ * auVar243._0_4_;
          auVar56._8_4_ = local_480._8_4_ * auVar243._8_4_;
          auVar56._12_4_ = local_480._12_4_ * auVar243._12_4_;
          auVar56._16_4_ = local_480._16_4_ * auVar243._16_4_;
          auVar56._20_4_ = local_480._20_4_ * auVar243._20_4_;
          auVar56._24_4_ = local_480._24_4_ * auVar243._24_4_;
          auVar56._28_4_ = auVar106._28_4_;
          auVar76 = vfmadd213ps_fma(auVar91,local_460,auVar56);
          auVar76 = vfmadd213ps_fma(auVar107,local_440,ZEXT1632(auVar76));
          auVar106 = vandps_avx(ZEXT1632(auVar76),auVar234);
          uVar18 = vcmpps_avx512vl(auVar106,auVar232,1);
          bVar70 = (byte)uVar18 | ~bVar70;
          auVar151._8_4_ = 2;
          auVar151._0_8_ = 0x200000002;
          auVar151._12_4_ = 2;
          auVar151._16_4_ = 2;
          auVar151._20_4_ = 2;
          auVar151._24_4_ = 2;
          auVar151._28_4_ = 2;
          auVar31._8_4_ = 3;
          auVar31._0_8_ = 0x300000003;
          auVar31._12_4_ = 3;
          auVar31._16_4_ = 3;
          auVar31._20_4_ = 3;
          auVar31._24_4_ = 3;
          auVar31._28_4_ = 3;
          auVar106 = vpblendmd_avx512vl(auVar151,auVar31);
          local_320._0_4_ = (uint)(bVar70 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar70 & 1) * 2;
          bVar72 = (bool)(bVar70 >> 1 & 1);
          local_320._4_4_ = (uint)bVar72 * auVar106._4_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar70 >> 2 & 1);
          local_320._8_4_ = (uint)bVar72 * auVar106._8_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar70 >> 3 & 1);
          local_320._12_4_ = (uint)bVar72 * auVar106._12_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar70 >> 4 & 1);
          local_320._16_4_ = (uint)bVar72 * auVar106._16_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar70 >> 5 & 1);
          local_320._20_4_ = (uint)bVar72 * auVar106._20_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)(bVar70 >> 6 & 1);
          local_320._24_4_ = (uint)bVar72 * auVar106._24_4_ | (uint)!bVar72 * 2;
          local_320._28_4_ = (uint)(bVar70 >> 7) * auVar106._28_4_ | (uint)!(bool)(bVar70 >> 7) * 2;
          local_380 = vpbroadcastd_avx512vl();
          uVar18 = vpcmpd_avx512vl(local_380,local_320,5);
          local_86c = (uint)bVar67;
          local_3c0 = local_420._0_4_ + (float)local_400._0_4_;
          fStack_3bc = local_420._4_4_ + (float)local_400._4_4_;
          fStack_3b8 = local_420._8_4_ + fStack_3f8;
          fStack_3b4 = local_420._12_4_ + fStack_3f4;
          fStack_3b0 = local_420._16_4_ + fStack_3f0;
          fStack_3ac = local_420._20_4_ + fStack_3ec;
          fStack_3a8 = local_420._24_4_ + fStack_3e8;
          fStack_3a4 = local_420._28_4_ + fStack_3e4;
          for (bVar67 = (byte)uVar18 & bVar67; bVar67 != 0; bVar67 = ~bVar70 & bVar67 & (byte)uVar18
              ) {
            auVar152._8_4_ = 0x7f800000;
            auVar152._0_8_ = 0x7f8000007f800000;
            auVar152._12_4_ = 0x7f800000;
            auVar152._16_4_ = 0x7f800000;
            auVar152._20_4_ = 0x7f800000;
            auVar152._24_4_ = 0x7f800000;
            auVar152._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar152,local_420);
            auVar131._0_4_ =
                 (uint)(bVar67 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar67 & 1) * 0x7f800000;
            bVar72 = (bool)(bVar67 >> 1 & 1);
            auVar131._4_4_ = (uint)bVar72 * auVar106._4_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar67 >> 2 & 1);
            auVar131._8_4_ = (uint)bVar72 * auVar106._8_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar67 >> 3 & 1);
            auVar131._12_4_ = (uint)bVar72 * auVar106._12_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar67 >> 4 & 1);
            auVar131._16_4_ = (uint)bVar72 * auVar106._16_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar67 >> 5 & 1);
            auVar131._20_4_ = (uint)bVar72 * auVar106._20_4_ | (uint)!bVar72 * 0x7f800000;
            auVar131._24_4_ =
                 (uint)(bVar67 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar67 >> 6) * 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar131,auVar131,0xb1);
            auVar106 = vminps_avx(auVar131,auVar106);
            auVar107 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar107);
            auVar107 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar107);
            uVar18 = vcmpps_avx512vl(auVar131,auVar106,0);
            bVar64 = (byte)uVar18 & bVar67;
            bVar70 = bVar67;
            if (bVar64 != 0) {
              bVar70 = bVar64;
            }
            iVar21 = 0;
            for (uVar74 = (uint)bVar70; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            bVar70 = '\x01' << ((byte)iVar21 & 0x1f);
            fVar236 = *(float *)(local_1e0 + (uint)(iVar21 << 2));
            auVar238 = ZEXT464(*(uint *)(local_1c0 + (uint)(iVar21 << 2)));
            fVar254 = local_868;
            if ((float)local_700._0_4_ < 0.0) {
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_1c0 + (uint)(iVar21 << 2)));
              auVar235 = ZEXT1664(auVar235._0_16_);
              auVar241 = ZEXT1664(auVar241._0_16_);
              auVar245 = ZEXT1664(auVar245._0_16_);
              auVar251 = ZEXT1664(auVar251._0_16_);
              fVar254 = sqrtf((float)local_700._0_4_);
              auVar238 = ZEXT1664(local_7c0._0_16_);
              auVar261 = ZEXT3264(local_860);
              auVar260 = ZEXT3264(local_840);
              auVar259 = ZEXT3264(local_820);
              auVar106 = vmovdqa64_avx512vl(auVar103);
              auVar258 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar105);
              auVar257 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar104);
              auVar256 = ZEXT3264(auVar106);
            }
            uVar73 = (ulong)bVar70;
            auVar75 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar76 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar84 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar78 = vminps_avx(auVar75,auVar84);
            auVar75 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar84 = vmaxps_avx(auVar76,auVar75);
            auVar206._8_4_ = 0x7fffffff;
            auVar206._0_8_ = 0x7fffffff7fffffff;
            auVar206._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx(auVar78,auVar206);
            auVar75 = vandps_avx(auVar84,auVar206);
            auVar76 = vmaxps_avx(auVar76,auVar75);
            auVar75 = vmovshdup_avx(auVar76);
            auVar75 = vmaxss_avx(auVar75,auVar76);
            auVar76 = vshufpd_avx(auVar76,auVar76,1);
            auVar76 = vmaxss_avx(auVar76,auVar75);
            fVar239 = auVar76._0_4_ * 1.9073486e-06;
            local_7a0._0_4_ = fVar254 * 1.9073486e-06;
            local_650 = vshufps_avx(auVar84,auVar84,0xff);
            uVar69 = 0;
            while( true ) {
              auVar76 = ZEXT416((uint)fVar236);
              bVar64 = (byte)uVar73;
              if (uVar69 == 5) break;
              local_7c0._0_16_ = auVar238._0_16_;
              uVar163 = auVar238._0_4_;
              auVar144._4_4_ = uVar163;
              auVar144._0_4_ = uVar163;
              auVar144._8_4_ = uVar163;
              auVar144._12_4_ = uVar163;
              auVar75 = vfmadd132ps_fma(auVar144,ZEXT816(0) << 0x40,local_6f0);
              fVar225 = 1.0 - fVar236;
              fVar213 = fVar225 * fVar225 * fVar225;
              fVar254 = fVar236 * fVar236;
              fVar224 = fVar236 * fVar254;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                        ZEXT416((uint)fVar224));
              fVar240 = fVar236 * fVar225;
              auVar82 = ZEXT416((uint)fVar225);
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar240 * 6.0)),
                                       ZEXT416((uint)(fVar240 * fVar225)),
                                       SUB6416(ZEXT464(0x41400000),0));
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                        ZEXT416((uint)fVar213));
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar225 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar236 * fVar240)));
              fVar213 = fVar213 * 0.16666667;
              fVar214 = (auVar84._0_4_ + auVar2._0_4_) * 0.16666667;
              fVar215 = (auVar78._0_4_ + auVar83._0_4_) * 0.16666667;
              fVar224 = fVar224 * 0.16666667;
              auVar183._0_4_ = fVar224 * (float)local_6e0._0_4_;
              auVar183._4_4_ = fVar224 * (float)local_6e0._4_4_;
              auVar183._8_4_ = fVar224 * fStack_6d8;
              auVar183._12_4_ = fVar224 * fStack_6d4;
              auVar217._4_4_ = fVar215;
              auVar217._0_4_ = fVar215;
              auVar217._8_4_ = fVar215;
              auVar217._12_4_ = fVar215;
              auVar84 = vfmadd132ps_fma(auVar217,auVar183,local_6a0._0_16_);
              auVar184._4_4_ = fVar214;
              auVar184._0_4_ = fVar214;
              auVar184._8_4_ = fVar214;
              auVar184._12_4_ = fVar214;
              auVar84 = vfmadd132ps_fma(auVar184,auVar84,local_6c0._0_16_);
              auVar165._4_4_ = fVar213;
              auVar165._0_4_ = fVar213;
              auVar165._8_4_ = fVar213;
              auVar165._12_4_ = fVar213;
              auVar84 = vfmadd132ps_fma(auVar165,auVar84,local_680._0_16_);
              local_580._0_16_ = auVar84;
              auVar75 = vsubps_avx(auVar75,auVar84);
              local_720._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_740._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                local_7e0._0_4_ = fVar254;
                local_800._0_4_ = fVar240;
                auVar241._0_4_ = sqrtf(auVar75._0_4_);
                auVar241._4_60_ = extraout_var;
                auVar75 = auVar241._0_16_;
                uVar73 = extraout_RAX;
                fVar240 = (float)local_800._0_4_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                local_7e0._0_4_ = fVar254;
              }
              local_5a0._4_4_ = fVar225;
              local_5a0._0_4_ = fVar225;
              fStack_598 = fVar225;
              fStack_594 = fVar225;
              auVar78 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar240 * 4.0)));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * 4.0)),auVar82,auVar82);
              fVar254 = fVar225 * -fVar225 * 0.5;
              fVar240 = auVar78._0_4_ * 0.5;
              fVar213 = auVar84._0_4_ * 0.5;
              local_7e0._0_4_ = (float)local_7e0._0_4_ * 0.5;
              auVar207._0_4_ = (float)local_7e0._0_4_ * (float)local_6e0._0_4_;
              auVar207._4_4_ = (float)local_7e0._0_4_ * (float)local_6e0._4_4_;
              auVar207._8_4_ = (float)local_7e0._0_4_ * fStack_6d8;
              auVar207._12_4_ = (float)local_7e0._0_4_ * fStack_6d4;
              auVar166._4_4_ = fVar213;
              auVar166._0_4_ = fVar213;
              auVar166._8_4_ = fVar213;
              auVar166._12_4_ = fVar213;
              auVar84 = vfmadd132ps_fma(auVar166,auVar207,local_6a0._0_16_);
              auVar185._4_4_ = fVar240;
              auVar185._0_4_ = fVar240;
              auVar185._8_4_ = fVar240;
              auVar185._12_4_ = fVar240;
              auVar84 = vfmadd132ps_fma(auVar185,auVar84,local_6c0._0_16_);
              auVar247._4_4_ = fVar254;
              auVar247._0_4_ = fVar254;
              auVar247._8_4_ = fVar254;
              auVar247._12_4_ = fVar254;
              _local_7e0 = vfmadd132ps_fma(auVar247,auVar84,local_680._0_16_);
              local_5c0._0_16_ = vdpps_avx(_local_7e0,_local_7e0,0x7f);
              auVar58._12_4_ = 0;
              auVar58._0_12_ = ZEXT812(0);
              fVar254 = local_5c0._0_4_;
              local_790 = vrsqrt14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar254));
              fVar240 = local_790._0_4_;
              local_5e0._0_16_ = vrcp14ss_avx512f(auVar58 << 0x20,ZEXT416((uint)fVar254));
              auVar84 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar84._0_4_;
              local_800._0_4_ = auVar75._0_4_;
              if (fVar254 < -fVar254) {
                auVar245._0_4_ = sqrtf(fVar254);
                auVar245._4_60_ = extraout_var_00;
                auVar75 = ZEXT416((uint)local_800._0_4_);
                auVar78 = auVar245._0_16_;
                uVar73 = extraout_RAX_00;
                auVar84 = _local_7e0;
              }
              else {
                auVar78 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                auVar84 = _local_7e0;
              }
              fVar213 = local_790._0_4_;
              fVar254 = fVar240 * 1.5 + fVar254 * -0.5 * fVar213 * fVar213 * fVar213;
              local_790._0_4_ = auVar84._0_4_ * fVar254;
              local_790._4_4_ = auVar84._4_4_ * fVar254;
              local_790._8_4_ = auVar84._8_4_ * fVar254;
              local_790._12_4_ = auVar84._12_4_ * fVar254;
              auVar2 = vdpps_avx(local_720._0_16_,local_790,0x7f);
              fVar214 = auVar75._0_4_;
              fVar240 = auVar2._0_4_;
              auVar145._0_4_ = fVar240 * fVar240;
              auVar145._4_4_ = auVar2._4_4_ * auVar2._4_4_;
              auVar145._8_4_ = auVar2._8_4_ * auVar2._8_4_;
              auVar145._12_4_ = auVar2._12_4_ * auVar2._12_4_;
              auVar83 = vsubps_avx(local_740._0_16_,auVar145);
              fVar213 = auVar83._0_4_;
              auVar167._4_12_ = ZEXT812(0) << 0x20;
              auVar167._0_4_ = fVar213;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar167);
              auVar79 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar83,ZEXT416(0xbf000000));
              if (fVar213 < 0.0) {
                local_620._0_4_ = auVar79._0_4_;
                local_640 = fVar254;
                fStack_63c = fVar254;
                fStack_638 = fVar254;
                fStack_634 = fVar254;
                local_630 = auVar77;
                fVar213 = sqrtf(fVar213);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar79 = ZEXT416((uint)local_620._0_4_);
                auVar78 = ZEXT416(auVar78._0_4_);
                auVar75 = ZEXT416((uint)local_800._0_4_);
                uVar73 = extraout_RAX_01;
                auVar84 = _local_7e0;
                auVar77 = local_630;
                fVar254 = local_640;
                fVar215 = fStack_63c;
                fVar224 = fStack_638;
                fVar225 = fStack_634;
              }
              else {
                auVar83 = vsqrtss_avx(auVar83,auVar83);
                fVar213 = auVar83._0_4_;
                fVar215 = fVar254;
                fVar224 = fVar254;
                fVar225 = fVar254;
              }
              auVar251 = ZEXT1664(auVar84);
              auVar245 = ZEXT1664(local_740._0_16_);
              auVar241 = ZEXT1664(local_720._0_16_);
              auVar106 = vmovdqa64_avx512vl(auVar104);
              auVar256 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar105);
              auVar257 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar103);
              auVar258 = ZEXT3264(auVar106);
              auVar259 = ZEXT3264(local_820);
              auVar260 = ZEXT3264(local_840);
              auVar261 = ZEXT3264(local_860);
              auVar83 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar82,auVar76);
              auVar76 = vfmadd231ss_fma(auVar82,auVar76,SUB6416(ZEXT464(0xc0000000),0));
              auVar186._0_4_ = fVar236 * (float)local_6e0._0_4_;
              auVar186._4_4_ = fVar236 * (float)local_6e0._4_4_;
              auVar186._8_4_ = fVar236 * fStack_6d8;
              auVar186._12_4_ = fVar236 * fStack_6d4;
              auVar208._0_4_ = auVar76._0_4_;
              auVar208._4_4_ = auVar208._0_4_;
              auVar208._8_4_ = auVar208._0_4_;
              auVar208._12_4_ = auVar208._0_4_;
              auVar76 = vfmadd132ps_fma(auVar208,auVar186,local_6a0._0_16_);
              auVar168._0_4_ = auVar83._0_4_;
              auVar168._4_4_ = auVar168._0_4_;
              auVar168._8_4_ = auVar168._0_4_;
              auVar168._12_4_ = auVar168._0_4_;
              auVar76 = vfmadd132ps_fma(auVar168,auVar76,local_6c0._0_16_);
              auVar76 = vfmadd132ps_fma(_local_5a0,auVar76,local_680._0_16_);
              auVar169._0_4_ = auVar76._0_4_ * (float)local_5c0._0_4_;
              auVar169._4_4_ = auVar76._4_4_ * (float)local_5c0._0_4_;
              auVar169._8_4_ = auVar76._8_4_ * (float)local_5c0._0_4_;
              auVar169._12_4_ = auVar76._12_4_ * (float)local_5c0._0_4_;
              auVar76 = vdpps_avx(auVar84,auVar76,0x7f);
              fVar181 = auVar76._0_4_;
              auVar187._0_4_ = auVar84._0_4_ * fVar181;
              auVar187._4_4_ = auVar84._4_4_ * fVar181;
              auVar187._8_4_ = auVar84._8_4_ * fVar181;
              auVar187._12_4_ = auVar84._12_4_ * fVar181;
              auVar76 = vsubps_avx(auVar169,auVar187);
              fVar181 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar22._8_4_ = 0x80000000;
              auVar22._0_8_ = 0x8000000080000000;
              auVar22._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar84,auVar22);
              auVar218._0_4_ = fVar254 * auVar76._0_4_ * fVar181;
              auVar218._4_4_ = fVar215 * auVar76._4_4_ * fVar181;
              auVar218._8_4_ = fVar224 * auVar76._8_4_ * fVar181;
              auVar218._12_4_ = fVar225 * auVar76._12_4_ * fVar181;
              auVar76 = vdpps_avx(auVar81,local_790,0x7f);
              auVar83 = vmaxss_avx(ZEXT416((uint)fVar239),
                                   ZEXT416((uint)((float)local_7c0._0_4_ * (float)local_7a0._0_4_)))
              ;
              auVar82 = vdivss_avx512f(ZEXT416((uint)fVar239),auVar78);
              auVar78 = vdpps_avx(local_720._0_16_,auVar218,0x7f);
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)fVar239),auVar83);
              auVar82 = vfmadd213ss_fma(ZEXT416((uint)(fVar214 + 1.0)),auVar82,auVar75);
              auVar75 = vdpps_avx(local_6f0,local_790,0x7f);
              fVar254 = auVar76._0_4_ + auVar78._0_4_;
              auVar76 = vdpps_avx(local_720._0_16_,auVar81,0x7f);
              auVar80 = vmulss_avx512f(auVar80,auVar77);
              auVar77 = vmulss_avx512f(auVar77,auVar77);
              auVar78 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar80 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar80._0_4_ * auVar77._0_4_)));
              auVar77 = vfnmadd231ss_fma(auVar76,auVar2,ZEXT416((uint)fVar254));
              auVar79 = vfnmadd231ss_fma(auVar78,auVar2,auVar75);
              auVar76 = vpermilps_avx(local_580._0_16_,0xff);
              fVar213 = fVar213 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar84,auVar84,0xff);
              auVar78 = vfmsub213ss_fma(auVar77,auVar80,auVar76);
              fVar214 = auVar79._0_4_ * auVar80._0_4_;
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar254),ZEXT416((uint)fVar214));
              auVar235 = ZEXT1664(auVar77);
              fVar215 = auVar77._0_4_;
              fVar236 = fVar236 - (fVar240 * (fVar214 / fVar215) -
                                  fVar213 * (auVar75._0_4_ / fVar215));
              fVar254 = (float)local_7c0._0_4_ -
                        (fVar213 * (fVar254 / fVar215) - fVar240 * (auVar78._0_4_ / fVar215));
              auVar238 = ZEXT464((uint)fVar254);
              auVar23._8_4_ = 0x7fffffff;
              auVar23._0_8_ = 0x7fffffff7fffffff;
              auVar23._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(auVar2,auVar23);
              if (auVar75._0_4_ < auVar82._0_4_) {
                auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar82._0_4_ + auVar83._0_4_)),local_650,
                                          ZEXT416(0x36000000));
                auVar24._8_4_ = 0x7fffffff;
                auVar24._0_8_ = 0x7fffffff7fffffff;
                auVar24._12_4_ = 0x7fffffff;
                auVar78 = vandps_avx512vl(ZEXT416((uint)fVar213),auVar24);
                if (auVar78._0_4_ < auVar75._0_4_) {
                  bVar72 = uVar69 < 5;
                  fVar239 = fVar254 + (float)local_660._0_4_;
                  if ((fVar16 <= fVar239) &&
                     (fVar240 = *(float *)(ray + k * 4 + 0x80), fVar239 <= fVar240)) {
                    bVar64 = 0;
                    if ((fVar236 < 0.0) || (1.0 < fVar236)) goto LAB_01b2a381;
                    auVar188._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar188._0_4_ = local_740._0_4_;
                    auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar188);
                    fVar213 = auVar75._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_778].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar64 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01b2a381;
                      fVar213 = fVar213 * 1.5 + local_740._0_4_ * -0.5 * fVar213 * fVar213 * fVar213
                      ;
                      auVar189._0_4_ = local_720._0_4_ * fVar213;
                      auVar189._4_4_ = local_720._4_4_ * fVar213;
                      auVar189._8_4_ = local_720._8_4_ * fVar213;
                      auVar189._12_4_ = local_720._12_4_ * fVar213;
                      auVar2 = vfmadd213ps_fma(auVar76,auVar189,auVar84);
                      auVar76 = vshufps_avx(auVar189,auVar189,0xc9);
                      auVar75 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar190._0_4_ = auVar189._0_4_ * auVar75._0_4_;
                      auVar190._4_4_ = auVar189._4_4_ * auVar75._4_4_;
                      auVar190._8_4_ = auVar189._8_4_ * auVar75._8_4_;
                      auVar190._12_4_ = auVar189._12_4_ * auVar75._12_4_;
                      auVar78 = vfmsub231ps_fma(auVar190,auVar84,auVar76);
                      auVar76 = vshufps_avx(auVar78,auVar78,0xc9);
                      auVar75 = vshufps_avx(auVar2,auVar2,0xc9);
                      auVar78 = vshufps_avx(auVar78,auVar78,0xd2);
                      auVar146._0_4_ = auVar2._0_4_ * auVar78._0_4_;
                      auVar146._4_4_ = auVar2._4_4_ * auVar78._4_4_;
                      auVar146._8_4_ = auVar2._8_4_ * auVar78._8_4_;
                      auVar146._12_4_ = auVar2._12_4_ * auVar78._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar146,auVar76,auVar75);
                      local_520 = (RTCHitN  [16])vshufps_avx(auVar76,auVar76,0x55);
                      auStack_510 = vshufps_avx(auVar76,auVar76,0xaa);
                      local_500 = auVar76._0_4_;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      local_4f0 = fVar236;
                      fStack_4ec = fVar236;
                      fStack_4e8 = fVar236;
                      fStack_4e4 = fVar236;
                      local_4e0 = ZEXT416(0) << 0x20;
                      local_4d0 = local_530._0_8_;
                      uStack_4c8 = local_530._8_8_;
                      local_4c0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_4ac = context->user->instID[0];
                      local_4b0 = uStack_4ac;
                      uStack_4a8 = uStack_4ac;
                      uStack_4a4 = uStack_4ac;
                      uStack_4a0 = context->user->instPrimID[0];
                      uStack_49c = uStack_4a0;
                      uStack_498 = uStack_4a0;
                      uStack_494 = uStack_4a0;
                      *(float *)(ray + k * 4 + 0x80) = fVar239;
                      local_880 = local_550;
                      local_770.valid = (int *)local_880;
                      local_770.geometryUserPtr = pGVar3->userPtr;
                      local_770.context = context->user;
                      local_770.hit = local_520;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar235 = ZEXT1664(auVar77);
                        auVar238 = ZEXT464((uint)fVar254);
                        auVar241 = ZEXT1664(local_720._0_16_);
                        auVar245 = ZEXT1664(local_740._0_16_);
                        auVar251 = ZEXT1664(auVar84);
                        (*pGVar3->occlusionFilterN)(&local_770);
                        auVar261 = ZEXT3264(local_860);
                        auVar260 = ZEXT3264(local_840);
                        auVar259 = ZEXT3264(local_820);
                        auVar106 = vmovdqa64_avx512vl(auVar103);
                        auVar258 = ZEXT3264(auVar106);
                        auVar106 = vmovdqa64_avx512vl(auVar105);
                        auVar257 = ZEXT3264(auVar106);
                        auVar106 = vmovdqa64_avx512vl(auVar104);
                        auVar256 = ZEXT3264(auVar106);
                      }
                      uVar73 = vptestmd_avx512vl(local_880,local_880);
                      if ((uVar73 & 0xf) != 0) {
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar235 = ZEXT1664(auVar235._0_16_);
                          auVar238 = ZEXT1664(auVar238._0_16_);
                          auVar241 = ZEXT1664(auVar241._0_16_);
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar251 = ZEXT1664(auVar251._0_16_);
                          (*p_Var7)(&local_770);
                          auVar261 = ZEXT3264(local_860);
                          auVar260 = ZEXT3264(local_840);
                          auVar259 = ZEXT3264(local_820);
                          auVar106 = vmovdqa64_avx512vl(auVar103);
                          auVar258 = ZEXT3264(auVar106);
                          auVar106 = vmovdqa64_avx512vl(auVar105);
                          auVar257 = ZEXT3264(auVar106);
                          auVar106 = vmovdqa64_avx512vl(auVar104);
                          auVar256 = ZEXT3264(auVar106);
                        }
                        uVar73 = vptestmd_avx512vl(local_880,local_880);
                        uVar73 = uVar73 & 0xf;
                        auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar8 = (bool)((byte)uVar73 & 1);
                        bVar9 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar11 = SUB81(uVar73 >> 3,0);
                        *(uint *)(local_770.ray + 0x80) =
                             (uint)bVar8 * auVar76._0_4_ |
                             (uint)!bVar8 * *(int *)(local_770.ray + 0x80);
                        *(uint *)(local_770.ray + 0x84) =
                             (uint)bVar9 * auVar76._4_4_ |
                             (uint)!bVar9 * *(int *)(local_770.ray + 0x84);
                        *(uint *)(local_770.ray + 0x88) =
                             (uint)bVar10 * auVar76._8_4_ |
                             (uint)!bVar10 * *(int *)(local_770.ray + 0x88);
                        *(uint *)(local_770.ray + 0x8c) =
                             (uint)bVar11 * auVar76._12_4_ |
                             (uint)!bVar11 * *(int *)(local_770.ray + 0x8c);
                        bVar64 = 1;
                        if ((byte)uVar73 != 0) goto LAB_01b2a381;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar240;
                    }
                  }
                  bVar64 = 0;
                  goto LAB_01b2a381;
                }
              }
              uVar69 = uVar69 + 1;
            }
            bVar72 = false;
LAB_01b2a381:
            bVar65 = bVar65 | bVar72 & bVar64;
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar227._4_4_ = uVar163;
            auVar227._0_4_ = uVar163;
            auVar227._8_4_ = uVar163;
            auVar227._12_4_ = uVar163;
            auVar227._16_4_ = uVar163;
            auVar227._20_4_ = uVar163;
            auVar227._24_4_ = uVar163;
            auVar227._28_4_ = uVar163;
            auVar229 = ZEXT3264(auVar227);
            auVar60._4_4_ = fStack_3bc;
            auVar60._0_4_ = local_3c0;
            auVar60._8_4_ = fStack_3b8;
            auVar60._12_4_ = fStack_3b4;
            auVar60._16_4_ = fStack_3b0;
            auVar60._20_4_ = fStack_3ac;
            auVar60._24_4_ = fStack_3a8;
            auVar60._28_4_ = fStack_3a4;
            uVar18 = vcmpps_avx512vl(auVar227,auVar60,0xd);
          }
          auVar153._0_4_ = (float)local_400._0_4_ + (float)local_3e0._0_4_;
          auVar153._4_4_ = (float)local_400._4_4_ + (float)local_3e0._4_4_;
          auVar153._8_4_ = fStack_3f8 + fStack_3d8;
          auVar153._12_4_ = fStack_3f4 + fStack_3d4;
          auVar153._16_4_ = fStack_3f0 + fStack_3d0;
          auVar153._20_4_ = fStack_3ec + fStack_3cc;
          auVar153._24_4_ = fStack_3e8 + fStack_3c8;
          auVar153._28_4_ = fStack_3e4 + fStack_3c4;
          uVar163 = auVar229._0_4_;
          auVar176._4_4_ = uVar163;
          auVar176._0_4_ = uVar163;
          auVar176._8_4_ = uVar163;
          auVar176._12_4_ = uVar163;
          auVar176._16_4_ = uVar163;
          auVar176._20_4_ = uVar163;
          auVar176._24_4_ = uVar163;
          auVar176._28_4_ = uVar163;
          uVar18 = vcmpps_avx512vl(auVar153,auVar176,2);
          auVar154._8_4_ = 2;
          auVar154._0_8_ = 0x200000002;
          auVar154._12_4_ = 2;
          auVar154._16_4_ = 2;
          auVar154._20_4_ = 2;
          auVar154._24_4_ = 2;
          auVar154._28_4_ = 2;
          auVar32._8_4_ = 3;
          auVar32._0_8_ = 0x300000003;
          auVar32._12_4_ = 3;
          auVar32._16_4_ = 3;
          auVar32._20_4_ = 3;
          auVar32._24_4_ = 3;
          auVar32._28_4_ = 3;
          auVar106 = vpblendmd_avx512vl(auVar154,auVar32);
          bVar72 = (bool)((byte)local_870 & 1);
          local_3e0._0_4_ = (uint)bVar72 * auVar106._0_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)((byte)(local_870 >> 1) & 1);
          local_3e0._4_4_ = (uint)bVar72 * auVar106._4_4_ | (uint)!bVar72 * 2;
          bVar72 = (bool)((byte)(local_870 >> 2) & 1);
          fStack_3d8 = (float)((uint)bVar72 * auVar106._8_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)((byte)(local_870 >> 3) & 1);
          fStack_3d4 = (float)((uint)bVar72 * auVar106._12_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)((byte)(local_870 >> 4) & 1);
          fStack_3d0 = (float)((uint)bVar72 * auVar106._16_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)((byte)(local_870 >> 5) & 1);
          fStack_3cc = (float)((uint)bVar72 * auVar106._20_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)((byte)(local_870 >> 6) & 1);
          fStack_3c8 = (float)((uint)bVar72 * auVar106._24_4_ | (uint)!bVar72 * 2);
          bVar72 = (bool)((byte)(local_870 >> 7) & 1);
          fStack_3c4 = (float)((uint)bVar72 * auVar106._28_4_ | (uint)!bVar72 * 2);
          bVar63 = (byte)uVar19 & bVar63 & (byte)uVar18;
          uVar18 = vpcmpd_avx512vl(_local_3e0,local_380,2);
          local_420 = _local_360;
          local_3c0 = (float)local_400._0_4_ + (float)local_360._0_4_;
          fStack_3bc = (float)local_400._4_4_ + (float)local_360._4_4_;
          fStack_3b8 = fStack_3f8 + fStack_358;
          fStack_3b4 = fStack_3f4 + fStack_354;
          fStack_3b0 = fStack_3f0 + fStack_350;
          fStack_3ac = fStack_3ec + fStack_34c;
          fStack_3a8 = fStack_3e8 + fStack_348;
          fStack_3a4 = fStack_3e4 + fStack_344;
          for (bVar70 = (byte)uVar18 & bVar63; bVar70 != 0; bVar70 = ~bVar67 & bVar70 & (byte)uVar18
              ) {
            auVar155._8_4_ = 0x7f800000;
            auVar155._0_8_ = 0x7f8000007f800000;
            auVar155._12_4_ = 0x7f800000;
            auVar155._16_4_ = 0x7f800000;
            auVar155._20_4_ = 0x7f800000;
            auVar155._24_4_ = 0x7f800000;
            auVar155._28_4_ = 0x7f800000;
            auVar106 = vblendmps_avx512vl(auVar155,local_420);
            auVar132._0_4_ =
                 (uint)(bVar70 & 1) * auVar106._0_4_ | (uint)!(bool)(bVar70 & 1) * 0x7f800000;
            bVar72 = (bool)(bVar70 >> 1 & 1);
            auVar132._4_4_ = (uint)bVar72 * auVar106._4_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar70 >> 2 & 1);
            auVar132._8_4_ = (uint)bVar72 * auVar106._8_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar70 >> 3 & 1);
            auVar132._12_4_ = (uint)bVar72 * auVar106._12_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar70 >> 4 & 1);
            auVar132._16_4_ = (uint)bVar72 * auVar106._16_4_ | (uint)!bVar72 * 0x7f800000;
            bVar72 = (bool)(bVar70 >> 5 & 1);
            auVar132._20_4_ = (uint)bVar72 * auVar106._20_4_ | (uint)!bVar72 * 0x7f800000;
            auVar132._24_4_ =
                 (uint)(bVar70 >> 6) * auVar106._24_4_ | (uint)!(bool)(bVar70 >> 6) * 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar106 = vshufps_avx(auVar132,auVar132,0xb1);
            auVar106 = vminps_avx(auVar132,auVar106);
            auVar107 = vshufpd_avx(auVar106,auVar106,5);
            auVar106 = vminps_avx(auVar106,auVar107);
            auVar107 = vpermpd_avx2(auVar106,0x4e);
            auVar106 = vminps_avx(auVar106,auVar107);
            uVar18 = vcmpps_avx512vl(auVar132,auVar106,0);
            bVar64 = (byte)uVar18 & bVar70;
            bVar67 = bVar70;
            if (bVar64 != 0) {
              bVar67 = bVar64;
            }
            iVar21 = 0;
            for (uVar74 = (uint)bVar67; (uVar74 & 1) == 0; uVar74 = uVar74 >> 1 | 0x80000000) {
              iVar21 = iVar21 + 1;
            }
            bVar67 = '\x01' << ((byte)iVar21 & 0x1f);
            fVar236 = *(float *)(local_200 + (uint)(iVar21 << 2));
            auVar238 = ZEXT464(*(uint *)(local_340 + (uint)(iVar21 << 2)));
            fVar254 = local_864;
            if ((float)local_700._0_4_ < 0.0) {
              local_7c0._0_16_ = ZEXT416(*(uint *)(local_340 + (uint)(iVar21 << 2)));
              auVar235 = ZEXT1664(auVar235._0_16_);
              auVar241 = ZEXT1664(auVar241._0_16_);
              auVar245 = ZEXT1664(auVar245._0_16_);
              auVar251 = ZEXT1664(auVar251._0_16_);
              fVar254 = sqrtf((float)local_700._0_4_);
              auVar238 = ZEXT1664(local_7c0._0_16_);
              auVar261 = ZEXT3264(local_860);
              auVar260 = ZEXT3264(local_840);
              auVar259 = ZEXT3264(local_820);
              auVar106 = vmovdqa64_avx512vl(auVar103);
              auVar258 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar105);
              auVar257 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar104);
              auVar256 = ZEXT3264(auVar106);
            }
            uVar73 = (ulong)bVar67;
            auVar75 = vminps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar76 = vmaxps_avx(local_680._0_16_,local_6c0._0_16_);
            auVar84 = vminps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar78 = vminps_avx(auVar75,auVar84);
            auVar75 = vmaxps_avx(local_6a0._0_16_,local_6e0._0_16_);
            auVar84 = vmaxps_avx(auVar76,auVar75);
            auVar209._8_4_ = 0x7fffffff;
            auVar209._0_8_ = 0x7fffffff7fffffff;
            auVar209._12_4_ = 0x7fffffff;
            auVar76 = vandps_avx(auVar78,auVar209);
            auVar75 = vandps_avx(auVar84,auVar209);
            auVar76 = vmaxps_avx(auVar76,auVar75);
            auVar75 = vmovshdup_avx(auVar76);
            auVar75 = vmaxss_avx(auVar75,auVar76);
            auVar76 = vshufpd_avx(auVar76,auVar76,1);
            auVar76 = vmaxss_avx(auVar76,auVar75);
            local_790._0_4_ = auVar76._0_4_ * 1.9073486e-06;
            local_650 = vshufps_avx(auVar84,auVar84,0xff);
            uVar69 = 0;
            while( true ) {
              auVar76 = ZEXT416((uint)fVar236);
              bVar64 = (byte)uVar73;
              if (uVar69 == 5) break;
              local_7c0._0_16_ = auVar238._0_16_;
              uVar163 = auVar238._0_4_;
              auVar147._4_4_ = uVar163;
              auVar147._0_4_ = uVar163;
              auVar147._8_4_ = uVar163;
              auVar147._12_4_ = uVar163;
              auVar75 = vfmadd132ps_fma(auVar147,ZEXT816(0) << 0x40,local_6f0);
              fVar225 = 1.0 - fVar236;
              fVar213 = fVar225 * fVar225 * fVar225;
              fVar239 = fVar236 * fVar236;
              fVar224 = fVar236 * fVar239;
              auVar84 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar213),
                                        ZEXT416((uint)fVar224));
              fVar240 = fVar236 * fVar225;
              auVar82 = ZEXT416((uint)fVar225);
              auVar2 = vfmadd231ss_fma(ZEXT416((uint)(fVar236 * fVar240 * 6.0)),
                                       ZEXT416((uint)(fVar240 * fVar225)),
                                       SUB6416(ZEXT464(0x41400000),0));
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40800000),0),ZEXT416((uint)fVar224),
                                        ZEXT416((uint)fVar213));
              auVar83 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * fVar225 * 6.0)),
                                        SUB6416(ZEXT464(0x41400000),0),
                                        ZEXT416((uint)(fVar236 * fVar240)));
              fVar213 = fVar213 * 0.16666667;
              fVar214 = (auVar84._0_4_ + auVar2._0_4_) * 0.16666667;
              fVar215 = (auVar78._0_4_ + auVar83._0_4_) * 0.16666667;
              fVar224 = fVar224 * 0.16666667;
              auVar191._0_4_ = fVar224 * (float)local_6e0._0_4_;
              auVar191._4_4_ = fVar224 * (float)local_6e0._4_4_;
              auVar191._8_4_ = fVar224 * fStack_6d8;
              auVar191._12_4_ = fVar224 * fStack_6d4;
              auVar219._4_4_ = fVar215;
              auVar219._0_4_ = fVar215;
              auVar219._8_4_ = fVar215;
              auVar219._12_4_ = fVar215;
              auVar84 = vfmadd132ps_fma(auVar219,auVar191,local_6a0._0_16_);
              auVar192._4_4_ = fVar214;
              auVar192._0_4_ = fVar214;
              auVar192._8_4_ = fVar214;
              auVar192._12_4_ = fVar214;
              auVar84 = vfmadd132ps_fma(auVar192,auVar84,local_6c0._0_16_);
              auVar170._4_4_ = fVar213;
              auVar170._0_4_ = fVar213;
              auVar170._8_4_ = fVar213;
              auVar170._12_4_ = fVar213;
              auVar84 = vfmadd132ps_fma(auVar170,auVar84,local_680._0_16_);
              local_580._0_16_ = auVar84;
              auVar75 = vsubps_avx(auVar75,auVar84);
              local_720._0_16_ = auVar75;
              auVar75 = vdpps_avx(auVar75,auVar75,0x7f);
              local_740._0_16_ = auVar75;
              if (auVar75._0_4_ < 0.0) {
                local_7e0._0_4_ = fVar239;
                local_800._0_4_ = fVar240;
                auVar229._0_4_ = sqrtf(auVar75._0_4_);
                auVar229._4_60_ = extraout_var_01;
                auVar75 = auVar229._0_16_;
                uVar73 = extraout_RAX_02;
                fVar240 = (float)local_800._0_4_;
              }
              else {
                auVar75 = vsqrtss_avx(auVar75,auVar75);
                local_7e0._0_4_ = fVar239;
              }
              local_5a0._4_4_ = fVar225;
              local_5a0._0_4_ = fVar225;
              fStack_598 = fVar225;
              fStack_594 = fVar225;
              auVar78 = vfnmsub213ss_fma(auVar76,auVar76,ZEXT416((uint)(fVar240 * 4.0)));
              auVar84 = vfmadd231ss_fma(ZEXT416((uint)(fVar240 * 4.0)),auVar82,auVar82);
              fVar239 = fVar225 * -fVar225 * 0.5;
              fVar240 = auVar78._0_4_ * 0.5;
              fVar213 = auVar84._0_4_ * 0.5;
              local_7e0._0_4_ = (float)local_7e0._0_4_ * 0.5;
              auVar210._0_4_ = (float)local_7e0._0_4_ * (float)local_6e0._0_4_;
              auVar210._4_4_ = (float)local_7e0._0_4_ * (float)local_6e0._4_4_;
              auVar210._8_4_ = (float)local_7e0._0_4_ * fStack_6d8;
              auVar210._12_4_ = (float)local_7e0._0_4_ * fStack_6d4;
              auVar171._4_4_ = fVar213;
              auVar171._0_4_ = fVar213;
              auVar171._8_4_ = fVar213;
              auVar171._12_4_ = fVar213;
              auVar84 = vfmadd132ps_fma(auVar171,auVar210,local_6a0._0_16_);
              auVar193._4_4_ = fVar240;
              auVar193._0_4_ = fVar240;
              auVar193._8_4_ = fVar240;
              auVar193._12_4_ = fVar240;
              auVar84 = vfmadd132ps_fma(auVar193,auVar84,local_6c0._0_16_);
              auVar248._4_4_ = fVar239;
              auVar248._0_4_ = fVar239;
              auVar248._8_4_ = fVar239;
              auVar248._12_4_ = fVar239;
              _local_7e0 = vfmadd132ps_fma(auVar248,auVar84,local_680._0_16_);
              local_5c0._0_16_ = vdpps_avx(_local_7e0,_local_7e0,0x7f);
              auVar59._12_4_ = 0;
              auVar59._0_12_ = ZEXT812(0);
              fVar239 = local_5c0._0_4_;
              auVar78 = vrsqrt14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar239));
              local_5e0._0_16_ = vrcp14ss_avx512f(auVar59 << 0x20,ZEXT416((uint)fVar239));
              auVar84 = vfnmadd213ss_fma(local_5e0._0_16_,local_5c0._0_16_,ZEXT416(0x40000000));
              local_600._0_4_ = auVar84._0_4_;
              local_800._0_4_ = auVar75._0_4_;
              if (fVar239 < -fVar239) {
                local_7a0 = auVar78;
                auVar235._0_4_ = sqrtf(fVar239);
                auVar235._4_60_ = extraout_var_02;
                auVar75 = ZEXT416((uint)local_800._0_4_);
                auVar83 = auVar235._0_16_;
                uVar73 = extraout_RAX_03;
                auVar84 = local_7a0;
                auVar2 = _local_7e0;
              }
              else {
                auVar83 = vsqrtss_avx512f(local_5c0._0_16_,local_5c0._0_16_);
                auVar84 = auVar78;
                auVar2 = _local_7e0;
              }
              fVar240 = auVar84._0_4_;
              fVar239 = auVar78._0_4_ * 1.5 + fVar239 * -0.5 * fVar240 * fVar240 * fVar240;
              auVar255._0_4_ = auVar2._0_4_ * fVar239;
              auVar255._4_4_ = auVar2._4_4_ * fVar239;
              auVar255._8_4_ = auVar2._8_4_ * fVar239;
              auVar255._12_4_ = auVar2._12_4_ * fVar239;
              auVar84 = vdpps_avx(local_720._0_16_,auVar255,0x7f);
              fVar240 = auVar75._0_4_ + 1.0;
              fVar213 = auVar84._0_4_;
              auVar148._0_4_ = fVar213 * fVar213;
              auVar148._4_4_ = auVar84._4_4_ * auVar84._4_4_;
              auVar148._8_4_ = auVar84._8_4_ * auVar84._8_4_;
              auVar148._12_4_ = auVar84._12_4_ * auVar84._12_4_;
              auVar78 = vsubps_avx(local_740._0_16_,auVar148);
              fVar214 = auVar78._0_4_;
              auVar172._4_12_ = ZEXT812(0) << 0x20;
              auVar172._0_4_ = fVar214;
              auVar77 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x40,auVar172);
              auVar79 = vmulss_avx512f(auVar77,ZEXT416(0x3fc00000));
              auVar80 = vmulss_avx512f(auVar78,ZEXT416(0xbf000000));
              if (fVar214 < 0.0) {
                local_7a0._0_4_ = fVar240;
                local_640 = fVar239;
                fStack_63c = fVar239;
                fStack_638 = fVar239;
                fStack_634 = fVar239;
                local_630 = auVar255;
                local_620 = auVar77;
                fVar214 = sqrtf(fVar214);
                auVar80 = ZEXT416(auVar80._0_4_);
                auVar79 = ZEXT416(auVar79._0_4_);
                auVar83 = ZEXT416(auVar83._0_4_);
                auVar75 = ZEXT416((uint)local_800._0_4_);
                uVar73 = extraout_RAX_04;
                auVar2 = _local_7e0;
                fVar240 = (float)local_7a0._0_4_;
                auVar255 = local_630;
                auVar77 = local_620;
                fVar239 = local_640;
                fVar215 = fStack_63c;
                fVar224 = fStack_638;
                fVar225 = fStack_634;
              }
              else {
                auVar78 = vsqrtss_avx(auVar78,auVar78);
                fVar214 = auVar78._0_4_;
                fVar215 = fVar239;
                fVar224 = fVar239;
                fVar225 = fVar239;
              }
              auVar251 = ZEXT1664(auVar2);
              auVar245 = ZEXT1664(local_740._0_16_);
              auVar241 = ZEXT1664(local_720._0_16_);
              auVar106 = vmovdqa64_avx512vl(auVar104);
              auVar256 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar105);
              auVar257 = ZEXT3264(auVar106);
              auVar106 = vmovdqa64_avx512vl(auVar103);
              auVar258 = ZEXT3264(auVar106);
              auVar259 = ZEXT3264(local_820);
              auVar260 = ZEXT3264(local_840);
              auVar261 = ZEXT3264(local_860);
              auVar78 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar82,auVar76);
              auVar76 = vfmadd231ss_fma(auVar82,auVar76,SUB6416(ZEXT464(0xc0000000),0));
              auVar194._0_4_ = fVar236 * (float)local_6e0._0_4_;
              auVar194._4_4_ = fVar236 * (float)local_6e0._4_4_;
              auVar194._8_4_ = fVar236 * fStack_6d8;
              auVar194._12_4_ = fVar236 * fStack_6d4;
              auVar211._0_4_ = auVar76._0_4_;
              auVar211._4_4_ = auVar211._0_4_;
              auVar211._8_4_ = auVar211._0_4_;
              auVar211._12_4_ = auVar211._0_4_;
              auVar76 = vfmadd132ps_fma(auVar211,auVar194,local_6a0._0_16_);
              auVar173._0_4_ = auVar78._0_4_;
              auVar173._4_4_ = auVar173._0_4_;
              auVar173._8_4_ = auVar173._0_4_;
              auVar173._12_4_ = auVar173._0_4_;
              auVar76 = vfmadd132ps_fma(auVar173,auVar76,local_6c0._0_16_);
              auVar76 = vfmadd132ps_fma(_local_5a0,auVar76,local_680._0_16_);
              auVar174._0_4_ = auVar76._0_4_ * (float)local_5c0._0_4_;
              auVar174._4_4_ = auVar76._4_4_ * (float)local_5c0._0_4_;
              auVar174._8_4_ = auVar76._8_4_ * (float)local_5c0._0_4_;
              auVar174._12_4_ = auVar76._12_4_ * (float)local_5c0._0_4_;
              auVar76 = vdpps_avx(auVar2,auVar76,0x7f);
              fVar181 = auVar76._0_4_;
              auVar195._0_4_ = auVar2._0_4_ * fVar181;
              auVar195._4_4_ = auVar2._4_4_ * fVar181;
              auVar195._8_4_ = auVar2._8_4_ * fVar181;
              auVar195._12_4_ = auVar2._12_4_ * fVar181;
              auVar76 = vsubps_avx(auVar174,auVar195);
              fVar181 = (float)local_600._0_4_ * (float)local_5e0._0_4_;
              auVar25._8_4_ = 0x80000000;
              auVar25._0_8_ = 0x8000000080000000;
              auVar25._12_4_ = 0x80000000;
              auVar81 = vxorps_avx512vl(auVar2,auVar25);
              auVar220._0_4_ = fVar239 * auVar76._0_4_ * fVar181;
              auVar220._4_4_ = fVar215 * auVar76._4_4_ * fVar181;
              auVar220._8_4_ = fVar224 * auVar76._8_4_ * fVar181;
              auVar220._12_4_ = fVar225 * auVar76._12_4_ * fVar181;
              auVar76 = vdpps_avx(auVar81,auVar255,0x7f);
              auVar82 = vmaxss_avx(ZEXT416((uint)local_790._0_4_),
                                   ZEXT416((uint)((float)local_7c0._0_4_ * fVar254 * 1.9073486e-06))
                                  );
              auVar83 = vdivss_avx512f(ZEXT416((uint)local_790._0_4_),auVar83);
              auVar78 = vdpps_avx(local_720._0_16_,auVar220,0x7f);
              auVar75 = vfmadd213ss_fma(auVar75,ZEXT416((uint)local_790._0_4_),auVar82);
              auVar83 = vfmadd213ss_fma(ZEXT416((uint)fVar240),auVar83,auVar75);
              auVar75 = vdpps_avx(local_6f0,auVar255,0x7f);
              fVar239 = auVar76._0_4_ + auVar78._0_4_;
              auVar76 = vdpps_avx(local_720._0_16_,auVar81,0x7f);
              auVar80 = vmulss_avx512f(auVar80,auVar77);
              auVar77 = vmulss_avx512f(auVar77,auVar77);
              auVar78 = vdpps_avx(local_720._0_16_,local_6f0,0x7f);
              auVar80 = vaddss_avx512f(auVar79,ZEXT416((uint)(auVar80._0_4_ * auVar77._0_4_)));
              auVar77 = vfnmadd231ss_fma(auVar76,auVar84,ZEXT416((uint)fVar239));
              auVar79 = vfnmadd231ss_fma(auVar78,auVar84,auVar75);
              auVar76 = vpermilps_avx(local_580._0_16_,0xff);
              fVar214 = fVar214 - auVar76._0_4_;
              auVar76 = vshufps_avx(auVar2,auVar2,0xff);
              auVar78 = vfmsub213ss_fma(auVar77,auVar80,auVar76);
              fVar240 = auVar79._0_4_ * auVar80._0_4_;
              auVar77 = vfmsub231ss_fma(ZEXT416((uint)(auVar75._0_4_ * auVar78._0_4_)),
                                        ZEXT416((uint)fVar239),ZEXT416((uint)fVar240));
              auVar235 = ZEXT1664(auVar77);
              fVar215 = auVar77._0_4_;
              fVar236 = fVar236 - (fVar213 * (fVar240 / fVar215) -
                                  fVar214 * (auVar75._0_4_ / fVar215));
              fVar239 = (float)local_7c0._0_4_ -
                        (fVar214 * (fVar239 / fVar215) - fVar213 * (auVar78._0_4_ / fVar215));
              auVar238 = ZEXT464((uint)fVar239);
              auVar26._8_4_ = 0x7fffffff;
              auVar26._0_8_ = 0x7fffffff7fffffff;
              auVar26._12_4_ = 0x7fffffff;
              auVar75 = vandps_avx512vl(auVar84,auVar26);
              if (auVar75._0_4_ < auVar83._0_4_) {
                auVar75 = vfmadd231ss_fma(ZEXT416((uint)(auVar83._0_4_ + auVar82._0_4_)),local_650,
                                          ZEXT416(0x36000000));
                auVar27._8_4_ = 0x7fffffff;
                auVar27._0_8_ = 0x7fffffff7fffffff;
                auVar27._12_4_ = 0x7fffffff;
                auVar84 = vandps_avx512vl(ZEXT416((uint)fVar214),auVar27);
                if (auVar84._0_4_ < auVar75._0_4_) {
                  bVar72 = uVar69 < 5;
                  fVar254 = fVar239 + (float)local_660._0_4_;
                  if ((fVar16 <= fVar254) &&
                     (fVar240 = *(float *)(ray + k * 4 + 0x80), fVar254 <= fVar240)) {
                    bVar64 = 0;
                    if ((fVar236 < 0.0) || (1.0 < fVar236)) goto LAB_01b2af87;
                    auVar196._4_12_ = SUB1612(ZEXT816(0),0);
                    auVar196._0_4_ = local_740._0_4_;
                    auVar75 = vrsqrt14ss_avx512f(ZEXT816(0) << 0x20,auVar196);
                    fVar213 = auVar75._0_4_;
                    pGVar3 = (context->scene->geometries).items[local_778].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                      if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                         (bVar64 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                      goto LAB_01b2af87;
                      fVar213 = fVar213 * 1.5 + local_740._0_4_ * -0.5 * fVar213 * fVar213 * fVar213
                      ;
                      auVar197._0_4_ = local_720._0_4_ * fVar213;
                      auVar197._4_4_ = local_720._4_4_ * fVar213;
                      auVar197._8_4_ = local_720._8_4_ * fVar213;
                      auVar197._12_4_ = local_720._12_4_ * fVar213;
                      auVar78 = vfmadd213ps_fma(auVar76,auVar197,auVar2);
                      auVar76 = vshufps_avx(auVar197,auVar197,0xc9);
                      auVar75 = vshufps_avx(auVar2,auVar2,0xc9);
                      auVar198._0_4_ = auVar197._0_4_ * auVar75._0_4_;
                      auVar198._4_4_ = auVar197._4_4_ * auVar75._4_4_;
                      auVar198._8_4_ = auVar197._8_4_ * auVar75._8_4_;
                      auVar198._12_4_ = auVar197._12_4_ * auVar75._12_4_;
                      auVar84 = vfmsub231ps_fma(auVar198,auVar2,auVar76);
                      auVar76 = vshufps_avx(auVar84,auVar84,0xc9);
                      auVar75 = vshufps_avx(auVar78,auVar78,0xc9);
                      auVar84 = vshufps_avx(auVar84,auVar84,0xd2);
                      auVar149._0_4_ = auVar78._0_4_ * auVar84._0_4_;
                      auVar149._4_4_ = auVar78._4_4_ * auVar84._4_4_;
                      auVar149._8_4_ = auVar78._8_4_ * auVar84._8_4_;
                      auVar149._12_4_ = auVar78._12_4_ * auVar84._12_4_;
                      auVar76 = vfmsub231ps_fma(auVar149,auVar76,auVar75);
                      local_520 = (RTCHitN  [16])vshufps_avx(auVar76,auVar76,0x55);
                      auStack_510 = vshufps_avx(auVar76,auVar76,0xaa);
                      local_500 = auVar76._0_4_;
                      uStack_4fc = local_500;
                      uStack_4f8 = local_500;
                      uStack_4f4 = local_500;
                      local_4f0 = fVar236;
                      fStack_4ec = fVar236;
                      fStack_4e8 = fVar236;
                      fStack_4e4 = fVar236;
                      local_4e0 = ZEXT416(0) << 0x20;
                      local_4d0 = local_530._0_8_;
                      uStack_4c8 = local_530._8_8_;
                      local_4c0 = local_540;
                      vpcmpeqd_avx2(ZEXT1632(local_540),ZEXT1632(local_540));
                      uStack_4ac = context->user->instID[0];
                      local_4b0 = uStack_4ac;
                      uStack_4a8 = uStack_4ac;
                      uStack_4a4 = uStack_4ac;
                      uStack_4a0 = context->user->instPrimID[0];
                      uStack_49c = uStack_4a0;
                      uStack_498 = uStack_4a0;
                      uStack_494 = uStack_4a0;
                      *(float *)(ray + k * 4 + 0x80) = fVar254;
                      local_880 = local_550;
                      local_770.valid = (int *)local_880;
                      local_770.geometryUserPtr = pGVar3->userPtr;
                      local_770.context = context->user;
                      local_770.hit = local_520;
                      local_770.N = 4;
                      local_770.ray = (RTCRayN *)ray;
                      if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                        auVar235 = ZEXT1664(auVar77);
                        auVar238 = ZEXT464((uint)fVar239);
                        auVar241 = ZEXT1664(local_720._0_16_);
                        auVar245 = ZEXT1664(local_740._0_16_);
                        auVar251 = ZEXT1664(auVar2);
                        (*pGVar3->occlusionFilterN)(&local_770);
                        auVar261 = ZEXT3264(local_860);
                        auVar260 = ZEXT3264(local_840);
                        auVar259 = ZEXT3264(local_820);
                        auVar106 = vmovdqa64_avx512vl(auVar103);
                        auVar258 = ZEXT3264(auVar106);
                        auVar106 = vmovdqa64_avx512vl(auVar105);
                        auVar257 = ZEXT3264(auVar106);
                        auVar106 = vmovdqa64_avx512vl(auVar104);
                        auVar256 = ZEXT3264(auVar106);
                      }
                      uVar73 = vptestmd_avx512vl(local_880,local_880);
                      if ((uVar73 & 0xf) != 0) {
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar235 = ZEXT1664(auVar235._0_16_);
                          auVar238 = ZEXT1664(auVar238._0_16_);
                          auVar241 = ZEXT1664(auVar241._0_16_);
                          auVar245 = ZEXT1664(auVar245._0_16_);
                          auVar251 = ZEXT1664(auVar251._0_16_);
                          (*p_Var7)(&local_770);
                          auVar261 = ZEXT3264(local_860);
                          auVar260 = ZEXT3264(local_840);
                          auVar259 = ZEXT3264(local_820);
                          auVar106 = vmovdqa64_avx512vl(auVar103);
                          auVar258 = ZEXT3264(auVar106);
                          auVar106 = vmovdqa64_avx512vl(auVar105);
                          auVar257 = ZEXT3264(auVar106);
                          auVar106 = vmovdqa64_avx512vl(auVar104);
                          auVar256 = ZEXT3264(auVar106);
                        }
                        uVar73 = vptestmd_avx512vl(local_880,local_880);
                        uVar73 = uVar73 & 0xf;
                        auVar76 = vbroadcastss_avx512vl(ZEXT416(0xff800000));
                        bVar8 = (bool)((byte)uVar73 & 1);
                        bVar9 = (bool)((byte)(uVar73 >> 1) & 1);
                        bVar10 = (bool)((byte)(uVar73 >> 2) & 1);
                        bVar11 = SUB81(uVar73 >> 3,0);
                        *(uint *)(local_770.ray + 0x80) =
                             (uint)bVar8 * auVar76._0_4_ |
                             (uint)!bVar8 * *(int *)(local_770.ray + 0x80);
                        *(uint *)(local_770.ray + 0x84) =
                             (uint)bVar9 * auVar76._4_4_ |
                             (uint)!bVar9 * *(int *)(local_770.ray + 0x84);
                        *(uint *)(local_770.ray + 0x88) =
                             (uint)bVar10 * auVar76._8_4_ |
                             (uint)!bVar10 * *(int *)(local_770.ray + 0x88);
                        *(uint *)(local_770.ray + 0x8c) =
                             (uint)bVar11 * auVar76._12_4_ |
                             (uint)!bVar11 * *(int *)(local_770.ray + 0x8c);
                        bVar64 = 1;
                        if ((byte)uVar73 != 0) goto LAB_01b2af87;
                      }
                      *(float *)(ray + k * 4 + 0x80) = fVar240;
                    }
                  }
                  bVar64 = 0;
                  goto LAB_01b2af87;
                }
              }
              uVar69 = uVar69 + 1;
            }
            bVar72 = false;
LAB_01b2af87:
            bVar65 = bVar65 | bVar72 & bVar64;
            uVar163 = *(undefined4 *)(ray + k * 4 + 0x80);
            auVar228._4_4_ = uVar163;
            auVar228._0_4_ = uVar163;
            auVar228._8_4_ = uVar163;
            auVar228._12_4_ = uVar163;
            auVar228._16_4_ = uVar163;
            auVar228._20_4_ = uVar163;
            auVar228._24_4_ = uVar163;
            auVar228._28_4_ = uVar163;
            auVar229 = ZEXT3264(auVar228);
            auVar61._4_4_ = fStack_3bc;
            auVar61._0_4_ = local_3c0;
            auVar61._8_4_ = fStack_3b8;
            auVar61._12_4_ = fStack_3b4;
            auVar61._16_4_ = fStack_3b0;
            auVar61._20_4_ = fStack_3ac;
            auVar61._24_4_ = fStack_3a8;
            auVar61._28_4_ = fStack_3a4;
            uVar18 = vcmpps_avx512vl(auVar228,auVar61,0xd);
          }
          uVar20 = vpcmpd_avx512vl(local_380,local_320,1);
          uVar19 = vpcmpd_avx512vl(local_380,_local_3e0,1);
          auVar177._0_4_ = (float)local_400._0_4_ + (float)local_1c0._0_4_;
          auVar177._4_4_ = (float)local_400._4_4_ + (float)local_1c0._4_4_;
          auVar177._8_4_ = fStack_3f8 + fStack_1b8;
          auVar177._12_4_ = fStack_3f4 + fStack_1b4;
          auVar177._16_4_ = fStack_3f0 + fStack_1b0;
          auVar177._20_4_ = fStack_3ec + fStack_1ac;
          auVar177._24_4_ = fStack_3e8 + fStack_1a8;
          auVar177._28_4_ = fStack_3e4 + fStack_1a4;
          uVar163 = auVar229._0_4_;
          auVar200._4_4_ = uVar163;
          auVar200._0_4_ = uVar163;
          auVar200._8_4_ = uVar163;
          auVar200._12_4_ = uVar163;
          auVar200._16_4_ = uVar163;
          auVar200._20_4_ = uVar163;
          auVar200._24_4_ = uVar163;
          auVar200._28_4_ = uVar163;
          uVar18 = vcmpps_avx512vl(auVar177,auVar200,2);
          bVar70 = (byte)local_86c & (byte)uVar20 & (byte)uVar18;
          auVar212._0_4_ = (float)local_400._0_4_ + (float)local_360._0_4_;
          auVar212._4_4_ = (float)local_400._4_4_ + (float)local_360._4_4_;
          auVar212._8_4_ = fStack_3f8 + fStack_358;
          auVar212._12_4_ = fStack_3f4 + fStack_354;
          auVar212._16_4_ = fStack_3f0 + fStack_350;
          auVar212._20_4_ = fStack_3ec + fStack_34c;
          auVar212._24_4_ = fStack_3e8 + fStack_348;
          auVar212._28_4_ = fStack_3e4 + fStack_344;
          uVar18 = vcmpps_avx512vl(auVar212,auVar200,2);
          bVar63 = bVar63 & (byte)uVar19 & (byte)uVar18 | bVar70;
          if (bVar63 != 0) {
            abStack_180[uVar68 * 0x60] = bVar63;
            bVar72 = (bool)(bVar70 >> 1 & 1);
            bVar8 = (bool)(bVar70 >> 2 & 1);
            bVar9 = (bool)(bVar70 >> 3 & 1);
            bVar10 = (bool)(bVar70 >> 4 & 1);
            bVar11 = (bool)(bVar70 >> 5 & 1);
            bVar12 = (bool)(bVar70 >> 6 & 1);
            auStack_160[uVar68 * 0x18] =
                 (uint)(bVar70 & 1) * local_1c0._0_4_ | (uint)!(bool)(bVar70 & 1) * local_360._0_4_;
            auStack_160[uVar68 * 0x18 + 1] =
                 (uint)bVar72 * local_1c0._4_4_ | (uint)!bVar72 * local_360._4_4_;
            auStack_160[uVar68 * 0x18 + 2] =
                 (uint)bVar8 * (int)fStack_1b8 | (uint)!bVar8 * (int)fStack_358;
            auStack_160[uVar68 * 0x18 + 3] =
                 (uint)bVar9 * (int)fStack_1b4 | (uint)!bVar9 * (int)fStack_354;
            auStack_160[uVar68 * 0x18 + 4] =
                 (uint)bVar10 * (int)fStack_1b0 | (uint)!bVar10 * (int)fStack_350;
            auStack_160[uVar68 * 0x18 + 5] =
                 (uint)bVar11 * (int)fStack_1ac | (uint)!bVar11 * (int)fStack_34c;
            auStack_160[uVar68 * 0x18 + 6] =
                 (uint)bVar12 * (int)fStack_1a8 | (uint)!bVar12 * (int)fStack_348;
            auStack_160[uVar68 * 0x18 + 7] =
                 (uint)(bVar70 >> 7) * (int)fStack_1a4 |
                 (uint)!(bool)(bVar70 >> 7) * (int)fStack_344;
            uVar73 = vmovlps_avx(local_390);
            (&uStack_140)[uVar68 * 0xc] = uVar73;
            aiStack_138[uVar68 * 0x18] = local_a20 + 1;
            uVar68 = (ulong)((int)uVar68 + 1);
          }
        }
        auVar106 = vbroadcastss_avx512vl(ZEXT416(0x3f800000));
        auVar263 = ZEXT3264(auVar106);
        auVar229 = ZEXT3264(_DAT_01f7b040);
      }
    }
    do {
      uVar74 = (uint)uVar68;
      uVar68 = (ulong)(uVar74 - 1);
      if (uVar74 == 0) {
        if (bVar65 != 0) goto LAB_01b2b563;
        uVar163 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar34._4_4_ = uVar163;
        auVar34._0_4_ = uVar163;
        auVar34._8_4_ = uVar163;
        auVar34._12_4_ = uVar163;
        auVar34._16_4_ = uVar163;
        auVar34._20_4_ = uVar163;
        auVar34._24_4_ = uVar163;
        auVar34._28_4_ = uVar163;
        uVar18 = vcmpps_avx512vl(local_300,auVar34,2);
        local_608 = (ulong)((uint)uVar18 & (uint)local_608 - 1 & (uint)local_608);
        goto LAB_01b28b84;
      }
      auVar106 = *(undefined1 (*) [32])(auStack_160 + uVar68 * 0x18);
      auVar178._0_4_ = auVar106._0_4_ + (float)local_400._0_4_;
      auVar178._4_4_ = auVar106._4_4_ + (float)local_400._4_4_;
      auVar178._8_4_ = auVar106._8_4_ + fStack_3f8;
      auVar178._12_4_ = auVar106._12_4_ + fStack_3f4;
      auVar178._16_4_ = auVar106._16_4_ + fStack_3f0;
      auVar178._20_4_ = auVar106._20_4_ + fStack_3ec;
      auVar178._24_4_ = auVar106._24_4_ + fStack_3e8;
      auVar178._28_4_ = auVar106._28_4_ + fStack_3e4;
      uVar163 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar33._4_4_ = uVar163;
      auVar33._0_4_ = uVar163;
      auVar33._8_4_ = uVar163;
      auVar33._12_4_ = uVar163;
      auVar33._16_4_ = uVar163;
      auVar33._20_4_ = uVar163;
      auVar33._24_4_ = uVar163;
      auVar33._28_4_ = uVar163;
      uVar18 = vcmpps_avx512vl(auVar178,auVar33,2);
      uVar134 = (uint)uVar18 & (uint)abStack_180[uVar68 * 0x60];
    } while (uVar134 == 0);
    uVar73 = (&uStack_140)[uVar68 * 0xc];
    auVar175._8_8_ = 0;
    auVar175._0_8_ = uVar73;
    auVar201._8_4_ = 0x7f800000;
    auVar201._0_8_ = 0x7f8000007f800000;
    auVar201._12_4_ = 0x7f800000;
    auVar201._16_4_ = 0x7f800000;
    auVar201._20_4_ = 0x7f800000;
    auVar201._24_4_ = 0x7f800000;
    auVar201._28_4_ = 0x7f800000;
    auVar107 = vblendmps_avx512vl(auVar201,auVar106);
    bVar63 = (byte)uVar134;
    auVar133._0_4_ =
         (uint)(bVar63 & 1) * auVar107._0_4_ | (uint)!(bool)(bVar63 & 1) * (int)auVar106._0_4_;
    bVar72 = (bool)((byte)(uVar134 >> 1) & 1);
    auVar133._4_4_ = (uint)bVar72 * auVar107._4_4_ | (uint)!bVar72 * (int)auVar106._4_4_;
    bVar72 = (bool)((byte)(uVar134 >> 2) & 1);
    auVar133._8_4_ = (uint)bVar72 * auVar107._8_4_ | (uint)!bVar72 * (int)auVar106._8_4_;
    bVar72 = (bool)((byte)(uVar134 >> 3) & 1);
    auVar133._12_4_ = (uint)bVar72 * auVar107._12_4_ | (uint)!bVar72 * (int)auVar106._12_4_;
    bVar72 = (bool)((byte)(uVar134 >> 4) & 1);
    auVar133._16_4_ = (uint)bVar72 * auVar107._16_4_ | (uint)!bVar72 * (int)auVar106._16_4_;
    bVar72 = (bool)((byte)(uVar134 >> 5) & 1);
    auVar133._20_4_ = (uint)bVar72 * auVar107._20_4_ | (uint)!bVar72 * (int)auVar106._20_4_;
    bVar72 = (bool)((byte)(uVar134 >> 6) & 1);
    auVar133._24_4_ = (uint)bVar72 * auVar107._24_4_ | (uint)!bVar72 * (int)auVar106._24_4_;
    auVar133._28_4_ =
         (uVar134 >> 7) * auVar107._28_4_ | (uint)!SUB41(uVar134 >> 7,0) * (int)auVar106._28_4_;
    auVar106 = vshufps_avx(auVar133,auVar133,0xb1);
    auVar106 = vminps_avx(auVar133,auVar106);
    auVar107 = vshufpd_avx(auVar106,auVar106,5);
    auVar106 = vminps_avx(auVar106,auVar107);
    auVar107 = vpermpd_avx2(auVar106,0x4e);
    auVar106 = vminps_avx(auVar106,auVar107);
    uVar18 = vcmpps_avx512vl(auVar133,auVar106,0);
    bVar70 = (byte)uVar18 & bVar63;
    if (bVar70 != 0) {
      uVar134 = (uint)bVar70;
    }
    uVar135 = 0;
    for (; (uVar134 & 1) == 0; uVar134 = uVar134 >> 1 | 0x80000000) {
      uVar135 = uVar135 + 1;
    }
    local_a20 = aiStack_138[uVar68 * 0x18];
    bVar63 = ~('\x01' << ((byte)uVar135 & 0x1f)) & bVar63;
    abStack_180[uVar68 * 0x60] = bVar63;
    if (bVar63 == 0) {
      uVar74 = uVar74 - 1;
    }
    uVar163 = (undefined4)uVar73;
    auVar156._4_4_ = uVar163;
    auVar156._0_4_ = uVar163;
    auVar156._8_4_ = uVar163;
    auVar156._12_4_ = uVar163;
    auVar156._16_4_ = uVar163;
    auVar156._20_4_ = uVar163;
    auVar156._24_4_ = uVar163;
    auVar156._28_4_ = uVar163;
    auVar76 = vmovshdup_avx(auVar175);
    auVar76 = vsubps_avx(auVar76,auVar175);
    auVar179._0_4_ = auVar76._0_4_;
    auVar179._4_4_ = auVar179._0_4_;
    auVar179._8_4_ = auVar179._0_4_;
    auVar179._12_4_ = auVar179._0_4_;
    auVar179._16_4_ = auVar179._0_4_;
    auVar179._20_4_ = auVar179._0_4_;
    auVar179._24_4_ = auVar179._0_4_;
    auVar179._28_4_ = auVar179._0_4_;
    auVar76 = vfmadd132ps_fma(auVar179,auVar156,auVar229._0_32_);
    _local_520 = ZEXT1632(auVar76);
    local_390._8_8_ = 0;
    local_390._0_8_ = *(ulong *)(local_520 + (ulong)uVar135 * 4);
    uVar68 = (ulong)uVar74;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID),ray.time()[k]);

          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }